

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  byte bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar85;
  long lVar86;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ulong uVar87;
  uint uVar88;
  ulong uVar89;
  byte bVar90;
  float fVar91;
  float fVar92;
  float fVar139;
  float fVar140;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar97 [16];
  float fVar141;
  float fVar143;
  float fVar144;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar142;
  float fVar145;
  float fVar146;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar147;
  undefined4 uVar148;
  undefined8 uVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  undefined1 auVar180 [64];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  uint uVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_624;
  Precalculations *local_620;
  RayQueryContext *local_618;
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [16];
  ulong local_5e8;
  undefined1 local_5e0 [32];
  RTCFilterFunctionNArguments local_5b0;
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined4 local_528;
  float local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  uint local_514;
  uint local_510;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  Geometry *local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_410;
  undefined4 uStack_40c;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined4 local_300;
  int local_2fc;
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  byte local_2b0;
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar87 = (ulong)(byte)PVar12;
  fVar166 = *(float *)(prim + uVar87 * 0x19 + 0x12);
  auVar24 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar87 * 0x19 + 6));
  fVar165 = fVar166 * auVar24._0_4_;
  fVar147 = fVar166 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar87 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar95);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar87 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar94);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar87 * 6 + 6);
  auVar115 = vpmovsxbd_avx2(auVar151);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar114 = vpmovsxbd_avx2(auVar150);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar107 = vpmovsxbd_avx2(auVar93);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar104 = vcvtdq2ps_avx(auVar107);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar87 + 6);
  auVar102 = vpmovsxbd_avx2(auVar9);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar89 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar105 = vpmovsxbd_avx2(auVar10);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar89 + uVar87 + 6);
  auVar113 = vpmovsxbd_avx2(auVar11);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar83 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar100 = vpmovsxbd_avx2(auVar96);
  auVar106 = vcvtdq2ps_avx(auVar100);
  auVar208._4_4_ = fVar147;
  auVar208._0_4_ = fVar147;
  auVar208._8_4_ = fVar147;
  auVar208._12_4_ = fVar147;
  auVar208._16_4_ = fVar147;
  auVar208._20_4_ = fVar147;
  auVar208._24_4_ = fVar147;
  auVar208._28_4_ = fVar147;
  auVar210._8_4_ = 1;
  auVar210._0_8_ = 0x100000001;
  auVar210._12_4_ = 1;
  auVar210._16_4_ = 1;
  auVar210._20_4_ = 1;
  auVar210._24_4_ = 1;
  auVar210._28_4_ = 1;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar109 = ZEXT1632(CONCAT412(fVar166 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar166 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar166 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar147))));
  auVar108 = vpermps_avx2(auVar210,auVar109);
  auVar99 = vpermps_avx512vl(auVar98,auVar109);
  fVar147 = auVar99._0_4_;
  fVar186 = auVar99._4_4_;
  auVar109._4_4_ = fVar186 * auVar115._4_4_;
  auVar109._0_4_ = fVar147 * auVar115._0_4_;
  fVar187 = auVar99._8_4_;
  auVar109._8_4_ = fVar187 * auVar115._8_4_;
  fVar188 = auVar99._12_4_;
  auVar109._12_4_ = fVar188 * auVar115._12_4_;
  fVar181 = auVar99._16_4_;
  auVar109._16_4_ = fVar181 * auVar115._16_4_;
  fVar91 = auVar99._20_4_;
  auVar109._20_4_ = fVar91 * auVar115._20_4_;
  fVar92 = auVar99._24_4_;
  auVar109._24_4_ = fVar92 * auVar115._24_4_;
  auVar109._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar102._4_4_ * fVar186;
  auVar107._0_4_ = auVar102._0_4_ * fVar147;
  auVar107._8_4_ = auVar102._8_4_ * fVar187;
  auVar107._12_4_ = auVar102._12_4_ * fVar188;
  auVar107._16_4_ = auVar102._16_4_ * fVar181;
  auVar107._20_4_ = auVar102._20_4_ * fVar91;
  auVar107._24_4_ = auVar102._24_4_ * fVar92;
  auVar107._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar106._4_4_ * fVar186;
  auVar100._0_4_ = auVar106._0_4_ * fVar147;
  auVar100._8_4_ = auVar106._8_4_ * fVar187;
  auVar100._12_4_ = auVar106._12_4_ * fVar188;
  auVar100._16_4_ = auVar106._16_4_ * fVar181;
  auVar100._20_4_ = auVar106._20_4_ * fVar91;
  auVar100._24_4_ = auVar106._24_4_ * fVar92;
  auVar100._28_4_ = auVar99._28_4_;
  auVar95 = vfmadd231ps_fma(auVar109,auVar108,auVar101);
  auVar94 = vfmadd231ps_fma(auVar107,auVar108,auVar104);
  auVar151 = vfmadd231ps_fma(auVar100,auVar113,auVar108);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar208,auVar103);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar208,auVar114);
  auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar105,auVar208);
  auVar209._4_4_ = fVar165;
  auVar209._0_4_ = fVar165;
  auVar209._8_4_ = fVar165;
  auVar209._12_4_ = fVar165;
  auVar209._16_4_ = fVar165;
  auVar209._20_4_ = fVar165;
  auVar209._24_4_ = fVar165;
  auVar209._28_4_ = fVar165;
  auVar100 = ZEXT1632(CONCAT412(fVar166 * auVar24._12_4_,
                                CONCAT48(fVar166 * auVar24._8_4_,
                                         CONCAT44(fVar166 * auVar24._4_4_,fVar165))));
  auVar107 = vpermps_avx2(auVar210,auVar100);
  auVar100 = vpermps_avx512vl(auVar98,auVar100);
  fVar166 = auVar100._0_4_;
  fVar147 = auVar100._4_4_;
  auVar108._4_4_ = fVar147 * auVar115._4_4_;
  auVar108._0_4_ = fVar166 * auVar115._0_4_;
  fVar186 = auVar100._8_4_;
  auVar108._8_4_ = fVar186 * auVar115._8_4_;
  fVar187 = auVar100._12_4_;
  auVar108._12_4_ = fVar187 * auVar115._12_4_;
  fVar188 = auVar100._16_4_;
  auVar108._16_4_ = fVar188 * auVar115._16_4_;
  fVar181 = auVar100._20_4_;
  auVar108._20_4_ = fVar181 * auVar115._20_4_;
  fVar91 = auVar100._24_4_;
  auVar108._24_4_ = fVar91 * auVar115._24_4_;
  auVar108._28_4_ = 1;
  auVar98._4_4_ = auVar102._4_4_ * fVar147;
  auVar98._0_4_ = auVar102._0_4_ * fVar166;
  auVar98._8_4_ = auVar102._8_4_ * fVar186;
  auVar98._12_4_ = auVar102._12_4_ * fVar187;
  auVar98._16_4_ = auVar102._16_4_ * fVar188;
  auVar98._20_4_ = auVar102._20_4_ * fVar181;
  auVar98._24_4_ = auVar102._24_4_ * fVar91;
  auVar98._28_4_ = auVar115._28_4_;
  auVar102._4_4_ = auVar106._4_4_ * fVar147;
  auVar102._0_4_ = auVar106._0_4_ * fVar166;
  auVar102._8_4_ = auVar106._8_4_ * fVar186;
  auVar102._12_4_ = auVar106._12_4_ * fVar187;
  auVar102._16_4_ = auVar106._16_4_ * fVar188;
  auVar102._20_4_ = auVar106._20_4_ * fVar181;
  auVar102._24_4_ = auVar106._24_4_ * fVar91;
  auVar102._28_4_ = auVar100._28_4_;
  auVar150 = vfmadd231ps_fma(auVar108,auVar107,auVar101);
  auVar93 = vfmadd231ps_fma(auVar98,auVar107,auVar104);
  auVar9 = vfmadd231ps_fma(auVar102,auVar107,auVar113);
  auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar209,auVar103);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar209,auVar114);
  auVar198._8_4_ = 0x7fffffff;
  auVar198._0_8_ = 0x7fffffff7fffffff;
  auVar198._12_4_ = 0x7fffffff;
  auVar198._16_4_ = 0x7fffffff;
  auVar198._20_4_ = 0x7fffffff;
  auVar198._24_4_ = 0x7fffffff;
  auVar198._28_4_ = 0x7fffffff;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar209,auVar105);
  auVar103 = vandps_avx(ZEXT1632(auVar95),auVar198);
  auVar195._8_4_ = 0x219392ef;
  auVar195._0_8_ = 0x219392ef219392ef;
  auVar195._12_4_ = 0x219392ef;
  auVar195._16_4_ = 0x219392ef;
  auVar195._20_4_ = 0x219392ef;
  auVar195._24_4_ = 0x219392ef;
  auVar195._28_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar103,auVar195,1);
  bVar17 = (bool)((byte)uVar89 & 1);
  auVar99._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._0_4_;
  bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._4_4_;
  bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._8_4_;
  bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar95._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar94),auVar198);
  uVar89 = vcmpps_avx512vl(auVar103,auVar195,1);
  bVar17 = (bool)((byte)uVar89 & 1);
  auVar110._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar94._0_4_;
  bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar94._4_4_;
  bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar94._8_4_;
  bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar94._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar151),auVar198);
  uVar89 = vcmpps_avx512vl(auVar103,auVar195,1);
  bVar17 = (bool)((byte)uVar89 & 1);
  auVar103._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar151._0_4_;
  bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar151._4_4_;
  bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar151._8_4_;
  bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar151._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar89 >> 7) * 0x219392ef;
  auVar101 = vrcp14ps_avx512vl(auVar99);
  auVar196._8_4_ = 0x3f800000;
  auVar196._0_8_ = &DAT_3f8000003f800000;
  auVar196._12_4_ = 0x3f800000;
  auVar196._16_4_ = 0x3f800000;
  auVar196._20_4_ = 0x3f800000;
  auVar196._24_4_ = 0x3f800000;
  auVar196._28_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar99,auVar101,auVar196);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar110);
  auVar94 = vfnmadd213ps_fma(auVar110,auVar101,auVar196);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar103);
  auVar151 = vfnmadd213ps_fma(auVar103,auVar101,auVar196);
  auVar151 = vfmadd132ps_fma(ZEXT1632(auVar151),auVar101,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar150));
  auVar105._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar105._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar105._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar105._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar105._16_4_ = auVar103._16_4_ * 0.0;
  auVar105._20_4_ = auVar103._20_4_ * 0.0;
  auVar105._24_4_ = auVar103._24_4_ * 0.0;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 9 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar150));
  auVar102 = vpbroadcastd_avx512vl();
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar164._0_4_ = auVar95._0_4_ * auVar103._0_4_;
  auVar164._4_4_ = auVar95._4_4_ * auVar103._4_4_;
  auVar164._8_4_ = auVar95._8_4_ * auVar103._8_4_;
  auVar164._12_4_ = auVar95._12_4_ * auVar103._12_4_;
  auVar164._16_4_ = auVar103._16_4_ * 0.0;
  auVar164._20_4_ = auVar103._20_4_ * 0.0;
  auVar164._24_4_ = auVar103._24_4_ * 0.0;
  auVar164._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar87 * -2 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar93));
  auVar113._4_4_ = auVar94._4_4_ * auVar103._4_4_;
  auVar113._0_4_ = auVar94._0_4_ * auVar103._0_4_;
  auVar113._8_4_ = auVar94._8_4_ * auVar103._8_4_;
  auVar113._12_4_ = auVar94._12_4_ * auVar103._12_4_;
  auVar113._16_4_ = auVar103._16_4_ * 0.0;
  auVar113._20_4_ = auVar103._20_4_ * 0.0;
  auVar113._24_4_ = auVar103._24_4_ * 0.0;
  auVar113._28_4_ = auVar103._28_4_;
  auVar197 = ZEXT3264(auVar113);
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar93));
  auVar112._0_4_ = auVar94._0_4_ * auVar103._0_4_;
  auVar112._4_4_ = auVar94._4_4_ * auVar103._4_4_;
  auVar112._8_4_ = auVar94._8_4_ * auVar103._8_4_;
  auVar112._12_4_ = auVar94._12_4_ * auVar103._12_4_;
  auVar112._16_4_ = auVar103._16_4_ * 0.0;
  auVar112._20_4_ = auVar103._20_4_ * 0.0;
  auVar112._24_4_ = auVar103._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar87 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar9));
  auVar106._4_4_ = auVar103._4_4_ * auVar151._4_4_;
  auVar106._0_4_ = auVar103._0_4_ * auVar151._0_4_;
  auVar106._8_4_ = auVar103._8_4_ * auVar151._8_4_;
  auVar106._12_4_ = auVar103._12_4_ * auVar151._12_4_;
  auVar106._16_4_ = auVar103._16_4_ * 0.0;
  auVar106._20_4_ = auVar103._20_4_ * 0.0;
  auVar106._24_4_ = auVar103._24_4_ * 0.0;
  auVar106._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar87 * 0x17 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar9));
  auVar111._0_4_ = auVar151._0_4_ * auVar103._0_4_;
  auVar111._4_4_ = auVar151._4_4_ * auVar103._4_4_;
  auVar111._8_4_ = auVar151._8_4_ * auVar103._8_4_;
  auVar111._12_4_ = auVar151._12_4_ * auVar103._12_4_;
  auVar111._16_4_ = auVar103._16_4_ * 0.0;
  auVar111._20_4_ = auVar103._20_4_ * 0.0;
  auVar111._24_4_ = auVar103._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar105,auVar164);
  auVar101 = vpminsd_avx2(auVar113,auVar112);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101 = vpminsd_avx2(auVar106,auVar111);
  uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar115._4_4_ = uVar148;
  auVar115._0_4_ = uVar148;
  auVar115._8_4_ = uVar148;
  auVar115._12_4_ = uVar148;
  auVar115._16_4_ = uVar148;
  auVar115._20_4_ = uVar148;
  auVar115._24_4_ = uVar148;
  auVar115._28_4_ = uVar148;
  auVar101 = vmaxps_avx512vl(auVar101,auVar115);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar103,auVar101);
  auVar180 = ZEXT3264(local_80);
  auVar103 = vpmaxsd_avx2(auVar105,auVar164);
  auVar101 = vpmaxsd_avx2(auVar113,auVar112);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar101 = vpmaxsd_avx2(auVar106,auVar111);
  fVar166 = (ray->super_RayK<1>).tfar;
  auVar114._4_4_ = fVar166;
  auVar114._0_4_ = fVar166;
  auVar114._8_4_ = fVar166;
  auVar114._12_4_ = fVar166;
  auVar114._16_4_ = fVar166;
  auVar114._20_4_ = fVar166;
  auVar114._24_4_ = fVar166;
  auVar114._28_4_ = fVar166;
  auVar101 = vminps_avx512vl(auVar101,auVar114);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar104);
  uVar25 = vpcmpgtd_avx512vl(auVar102,_DAT_0205a920);
  uVar149 = vcmpps_avx512vl(local_80,auVar103,2);
  if ((byte)((byte)uVar149 & (byte)uVar25) != 0) {
    uVar89 = (ulong)(byte)((byte)uVar149 & (byte)uVar25);
    do {
      local_580 = auVar197._0_32_;
      local_5e0 = auVar180._0_32_;
      local_460 = in_ZMM21._0_32_;
      local_440 = in_ZMM20._0_32_;
      lVar27 = 0;
      for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar88 = *(uint *)(prim + 2);
      uVar85 = *(uint *)(prim + lVar27 * 4 + 6);
      local_608 = (ulong)uVar88;
      pGVar14 = (context->scene->geometries).items[uVar88].ptr;
      local_5e8 = (ulong)uVar85;
      uVar83 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar85);
      p_Var15 = pGVar14[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar14[1].time_range.upper;
      local_600 = *(undefined1 (*) [16])(lVar27 + (long)p_Var15 * uVar83);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar83 + 1) * (long)p_Var15);
      local_550 = *(undefined8 *)*pauVar3;
      uStack_548 = *(undefined8 *)(*pauVar3 + 8);
      auVar95 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar83 + 2) * (long)p_Var15);
      local_560 = *(undefined8 *)*pauVar4;
      uStack_558 = *(undefined8 *)(*pauVar4 + 8);
      auVar94 = *pauVar4;
      uVar89 = uVar89 - 1 & uVar89;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar83 + 3) * (long)p_Var15);
      local_2c0 = *(undefined8 *)*pauVar5;
      uStack_2b8 = *(undefined8 *)(*pauVar5 + 8);
      local_540 = (float)local_2c0;
      fStack_53c = (float)((ulong)local_2c0 >> 0x20);
      fStack_538 = (float)uStack_2b8;
      fStack_534 = (float)((ulong)uStack_2b8 >> 0x20);
      if (uVar89 != 0) {
        uVar87 = uVar89 - 1 & uVar89;
        for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        }
        if (uVar87 != 0) {
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar6 = (ray->super_RayK<1>).org.field_0;
      auVar150 = vsubps_avx(local_600,(undefined1  [16])aVar6);
      uVar148 = auVar150._0_4_;
      auVar159._4_4_ = uVar148;
      auVar159._0_4_ = uVar148;
      auVar159._8_4_ = uVar148;
      auVar159._12_4_ = uVar148;
      auVar151 = vshufps_avx(auVar150,auVar150,0x55);
      auVar150 = vshufps_avx(auVar150,auVar150,0xaa);
      aVar7 = (pre->ray_space).vx.field_0;
      aVar8 = (pre->ray_space).vy.field_0;
      fVar166 = (pre->ray_space).vz.field_0.m128[0];
      fVar147 = (pre->ray_space).vz.field_0.m128[1];
      fVar186 = (pre->ray_space).vz.field_0.m128[2];
      fVar187 = (pre->ray_space).vz.field_0.m128[3];
      auVar200._0_4_ = auVar150._0_4_ * fVar166;
      auVar200._4_4_ = auVar150._4_4_ * fVar147;
      auVar200._8_4_ = auVar150._8_4_ * fVar186;
      auVar200._12_4_ = auVar150._12_4_ * fVar187;
      auVar151 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar8,auVar151);
      auVar9 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar7,auVar159);
      auVar151 = vshufps_avx(local_600,local_600,0xff);
      auVar93 = vsubps_avx(auVar95,(undefined1  [16])aVar6);
      uVar148 = auVar93._0_4_;
      auVar167._4_4_ = uVar148;
      auVar167._0_4_ = uVar148;
      auVar167._8_4_ = uVar148;
      auVar167._12_4_ = uVar148;
      auVar150 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar201._0_4_ = auVar93._0_4_ * fVar166;
      auVar201._4_4_ = auVar93._4_4_ * fVar147;
      auVar201._8_4_ = auVar93._8_4_ * fVar186;
      auVar201._12_4_ = auVar93._12_4_ * fVar187;
      auVar150 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar8,auVar150);
      auVar10 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar7,auVar167);
      auVar95 = vshufps_avx(auVar95,auVar95,0xff);
      auVar93 = vsubps_avx(auVar94,(undefined1  [16])aVar6);
      uVar148 = auVar93._0_4_;
      auVar97._4_4_ = uVar148;
      auVar97._0_4_ = uVar148;
      auVar97._8_4_ = uVar148;
      auVar97._12_4_ = uVar148;
      auVar150 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar205._0_4_ = auVar93._0_4_ * fVar166;
      auVar205._4_4_ = auVar93._4_4_ * fVar147;
      auVar205._8_4_ = auVar93._8_4_ * fVar186;
      auVar205._12_4_ = auVar93._12_4_ * fVar187;
      auVar150 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar8,auVar150);
      auVar11 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar7,auVar97);
      auVar94 = vshufps_avx(auVar94,auVar94,0xff);
      auVar24._12_4_ = fStack_534;
      auVar24._0_12_ = *pauVar5;
      auVar93 = vsubps_avx512vl(auVar24,(undefined1  [16])aVar6);
      uVar148 = auVar93._0_4_;
      auVar168._4_4_ = uVar148;
      auVar168._0_4_ = uVar148;
      auVar168._8_4_ = uVar148;
      auVar168._12_4_ = uVar148;
      auVar150 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar206._0_4_ = auVar93._0_4_ * fVar166;
      auVar206._4_4_ = auVar93._4_4_ * fVar147;
      auVar206._8_4_ = auVar93._8_4_ * fVar186;
      auVar206._12_4_ = auVar93._12_4_ * fVar187;
      auVar150 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar8,auVar150);
      auVar150 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar7,auVar168);
      lVar27 = (long)iVar13 * 0x44;
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27);
      auVar93 = vshufps_avx512vl(auVar24,auVar24,0xff);
      local_3e0 = vbroadcastss_avx512vl(auVar9);
      auVar177._8_4_ = 1;
      auVar177._0_8_ = 0x100000001;
      auVar177._12_4_ = 1;
      auVar177._16_4_ = 1;
      auVar177._20_4_ = 1;
      auVar177._24_4_ = 1;
      auVar177._28_4_ = 1;
      local_4e0 = vpermps_avx512vl(auVar177,ZEXT1632(auVar9));
      uVar149 = auVar151._0_8_;
      local_a0._8_8_ = uVar149;
      local_a0._0_8_ = uVar149;
      local_a0._16_8_ = uVar149;
      local_a0._24_8_ = uVar149;
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x484);
      uVar148 = auVar10._0_4_;
      local_500._4_4_ = uVar148;
      local_500._0_4_ = uVar148;
      local_500._8_4_ = uVar148;
      local_500._12_4_ = uVar148;
      local_500._16_4_ = uVar148;
      local_500._20_4_ = uVar148;
      local_500._24_4_ = uVar148;
      local_500._28_4_ = uVar148;
      local_1e0 = vpermps_avx512vl(auVar177,ZEXT1632(auVar10));
      local_c0 = vbroadcastsd_avx512vl(auVar95);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar11);
      local_100 = vpermps_avx512vl(auVar177,ZEXT1632(auVar11));
      local_120 = vbroadcastsd_avx512vl(auVar94);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0xd8c);
      local_480 = vbroadcastss_avx512vl(auVar150);
      auVar218 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar177,ZEXT1632(auVar150));
      auVar219 = ZEXT3264(local_4a0);
      uVar149 = auVar93._0_8_;
      register0x000012c8 = uVar149;
      local_140 = uVar149;
      register0x000012d0 = uVar149;
      register0x000012d8 = uVar149;
      auVar104 = vmulps_avx512vl(local_480,auVar114);
      auVar102 = vmulps_avx512vl(local_4a0,auVar114);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,local_100);
      auVar95 = vfmadd231ps_fma(auVar104,auVar101,local_500);
      auVar105 = vfmadd231ps_avx512vl(auVar102,auVar101,local_1e0);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar103,local_3e0);
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x484);
      auVar107 = vfmadd231ps_avx512vl(auVar105,auVar103,local_4e0);
      auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x908);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0xd8c);
      auVar100 = vmulps_avx512vl(local_480,auVar113);
      auVar108 = vmulps_avx512vl(local_4a0,auVar113);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,local_100);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_500);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,local_1e0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_3e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,local_4e0);
      auVar109 = vsubps_avx512vl(auVar100,auVar106);
      auVar98 = vsubps_avx512vl(auVar108,auVar107);
      auVar99 = vmulps_avx512vl(auVar107,auVar109);
      auVar110 = vmulps_avx512vl(auVar106,auVar98);
      auVar99 = vsubps_avx512vl(auVar99,auVar110);
      auVar110 = vmulps_avx512vl(_local_140,auVar114);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_120);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,local_c0);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,local_a0);
      auVar111 = vmulps_avx512vl(_local_140,auVar113);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,local_120);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,local_c0);
      auVar151 = vfmadd231ps_fma(auVar111,auVar104,local_a0);
      auVar111 = vmulps_avx512vl(auVar98,auVar98);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,auVar109);
      auVar112 = vmaxps_avx512vl(auVar110,ZEXT1632(auVar151));
      auVar112 = vmulps_avx512vl(auVar112,auVar112);
      auVar111 = vmulps_avx512vl(auVar112,auVar111);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar149 = vcmpps_avx512vl(auVar99,auVar111,2);
      auVar95 = vblendps_avx(auVar9,local_600,8);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = vandps_avx512vl(auVar95,auVar93);
      auVar95 = vblendps_avx(auVar10,*pauVar3,8);
      auVar95 = vandps_avx512vl(auVar95,auVar93);
      auVar94 = vmaxps_avx(auVar94,auVar95);
      auVar95 = vblendps_avx(auVar11,*pauVar4,8);
      auVar96 = vandps_avx512vl(auVar95,auVar93);
      auVar95 = vblendps_avx(auVar150,auVar24,8);
      auVar95 = vandps_avx512vl(auVar95,auVar93);
      auVar95 = vmaxps_avx(auVar96,auVar95);
      auVar95 = vmaxps_avx(auVar94,auVar95);
      auVar94 = vmovshdup_avx(auVar95);
      auVar94 = vmaxss_avx(auVar94,auVar95);
      auVar95 = vshufpd_avx(auVar95,auVar95,1);
      auVar95 = vmaxss_avx(auVar95,auVar94);
      local_380._0_4_ = (undefined4)iVar13;
      register0x00001504 = auVar9._4_12_;
      auVar207._4_4_ = local_380._0_4_;
      auVar207._0_4_ = local_380._0_4_;
      auVar207._8_4_ = local_380._0_4_;
      auVar207._12_4_ = local_380._0_4_;
      auVar207._16_4_ = local_380._0_4_;
      auVar207._20_4_ = local_380._0_4_;
      auVar207._24_4_ = local_380._0_4_;
      auVar207._28_4_ = local_380._0_4_;
      uVar25 = vcmpps_avx512vl(auVar207,_DAT_02020f40,0xe);
      bVar90 = (byte)uVar149 & (byte)uVar25;
      auVar95 = vmulss_avx512f(auVar95,ZEXT416(0x35000000));
      auVar178._8_4_ = 2;
      auVar178._0_8_ = 0x200000002;
      auVar178._12_4_ = 2;
      auVar178._16_4_ = 2;
      auVar178._20_4_ = 2;
      auVar178._24_4_ = 2;
      auVar178._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar178,ZEXT1632(auVar9));
      local_180 = vpermps_avx512vl(auVar178,ZEXT1632(auVar10));
      local_1a0 = vpermps_avx512vl(auVar178,ZEXT1632(auVar11));
      local_1c0 = vpermps_avx2(auVar178,ZEXT1632(auVar150));
      uVar204 = *(uint *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar94 = auVar98._0_16_;
      if (bVar90 == 0) {
        auVar94 = vxorps_avx512vl(auVar94,auVar94);
        auVar216 = ZEXT1664(auVar94);
        auVar197 = ZEXT3264(local_580);
        in_ZMM20 = ZEXT3264(local_440);
        auVar180 = ZEXT3264(local_5e0);
        in_ZMM21 = ZEXT3264(local_460);
        auVar215 = ZEXT3264(local_3e0);
        auVar213 = ZEXT3264(local_4e0);
        auVar214 = ZEXT3264(local_500);
      }
      else {
        local_400._0_16_ = ZEXT416(uVar204);
        local_3c0._0_16_ = auVar95;
        auVar113 = vmulps_avx512vl(local_1c0,auVar113);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_1a0,auVar113);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar105);
        auVar102 = vfmadd213ps_avx512vl(auVar104,local_160,auVar102);
        auVar114 = vmulps_avx512vl(local_1c0,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_1a0,auVar114);
        auVar105 = vfmadd213ps_avx512vl(auVar101,local_180,auVar115);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1b18);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar103,local_160,auVar105);
        auVar103 = vmulps_avx512vl(local_480,auVar104);
        auVar113 = vmulps_avx512vl(local_4a0,auVar104);
        auVar104 = vmulps_avx512vl(local_1c0,auVar104);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar114,local_e0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar114,local_100);
        auVar114 = vfmadd231ps_avx512vl(auVar104,local_1a0,auVar114);
        auVar214 = ZEXT3264(local_500);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_500);
        auVar104 = vfmadd231ps_avx512vl(auVar113,auVar115,local_1e0);
        auVar113 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
        auVar99 = vfmadd231ps_avx512vl(auVar103,auVar101,local_3e0);
        auVar213 = ZEXT3264(local_4e0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,local_4e0);
        auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1f9c);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_160,auVar101);
        auVar101 = vmulps_avx512vl(local_480,auVar114);
        auVar111 = vmulps_avx512vl(local_4a0,auVar114);
        auVar114 = vmulps_avx512vl(local_1c0,auVar114);
        auVar217 = ZEXT1664(auVar95);
        auVar112 = vfmadd231ps_avx512vl(auVar101,auVar115,local_e0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_100);
        auVar115 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar115);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1694);
        auVar114 = vfmadd231ps_avx512vl(auVar112,auVar101,local_500);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,local_1e0);
        auVar101 = vfmadd231ps_avx512vl(auVar115,local_180,auVar101);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar103,local_3e0);
        auVar114 = vfmadd231ps_avx512vl(auVar111,auVar103,local_4e0);
        auVar111 = vfmadd231ps_avx512vl(auVar101,local_160,auVar103);
        auVar211._8_4_ = 0x7fffffff;
        auVar211._0_8_ = 0x7fffffff7fffffff;
        auVar211._12_4_ = 0x7fffffff;
        auVar211._16_4_ = 0x7fffffff;
        auVar211._20_4_ = 0x7fffffff;
        auVar211._24_4_ = 0x7fffffff;
        auVar211._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(auVar99,auVar211);
        auVar101 = vandps_avx(auVar104,auVar211);
        auVar101 = vmaxps_avx(auVar103,auVar101);
        auVar103 = vandps_avx(auVar113,auVar211);
        auVar103 = vmaxps_avx(auVar101,auVar103);
        auVar113 = vbroadcastss_avx512vl(auVar95);
        uVar83 = vcmpps_avx512vl(auVar103,auVar113,1);
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar116._0_4_ = (float)((uint)bVar17 * auVar109._0_4_ | (uint)!bVar17 * auVar99._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar17 * auVar109._4_4_ | (uint)!bVar17 * auVar99._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar17 * auVar109._8_4_ | (uint)!bVar17 * auVar99._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar17 * auVar109._12_4_ | (uint)!bVar17 * auVar99._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * auVar99._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar17 * auVar109._20_4_ | (uint)!bVar17 * auVar99._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar17 * auVar109._24_4_ | (uint)!bVar17 * auVar99._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar116._28_4_ = (uint)bVar17 * auVar109._28_4_ | (uint)!bVar17 * auVar99._28_4_;
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar117._0_4_ = (float)((uint)bVar17 * auVar98._0_4_ | (uint)!bVar17 * auVar104._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar104._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar104._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar104._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar17 * auVar98._16_4_ | (uint)!bVar17 * auVar104._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar17 * auVar98._20_4_ | (uint)!bVar17 * auVar104._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar17 * auVar98._24_4_ | (uint)!bVar17 * auVar104._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar117._28_4_ = (uint)bVar17 * auVar98._28_4_ | (uint)!bVar17 * auVar104._28_4_;
        auVar103 = vandps_avx(auVar211,auVar115);
        auVar101 = vandps_avx(auVar114,auVar211);
        auVar101 = vmaxps_avx(auVar103,auVar101);
        auVar103 = vandps_avx(auVar111,auVar211);
        auVar103 = vmaxps_avx(auVar101,auVar103);
        uVar83 = vcmpps_avx512vl(auVar103,auVar113,1);
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar118._0_4_ = (float)((uint)bVar17 * auVar109._0_4_ | (uint)!bVar17 * auVar115._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar17 * auVar109._4_4_ | (uint)!bVar17 * auVar115._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar17 * auVar109._8_4_ | (uint)!bVar17 * auVar115._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar17 * auVar109._12_4_ | (uint)!bVar17 * auVar115._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * auVar115._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar17 * auVar109._20_4_ | (uint)!bVar17 * auVar115._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar17 * auVar109._24_4_ | (uint)!bVar17 * auVar115._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar118._28_4_ = (uint)bVar17 * auVar109._28_4_ | (uint)!bVar17 * auVar115._28_4_;
        bVar17 = (bool)((byte)uVar83 & 1);
        auVar119._0_4_ = (float)((uint)bVar17 * auVar98._0_4_ | (uint)!bVar17 * auVar114._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar114._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar114._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar114._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar17 * auVar98._16_4_ | (uint)!bVar17 * auVar114._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar17 * auVar98._20_4_ | (uint)!bVar17 * auVar114._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar17 * auVar98._24_4_ | (uint)!bVar17 * auVar114._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar119._28_4_ = (uint)bVar17 * auVar98._28_4_ | (uint)!bVar17 * auVar114._28_4_;
        auVar97 = vxorps_avx512vl(auVar94,auVar94);
        auVar216 = ZEXT1664(auVar97);
        auVar103 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar97));
        auVar94 = vfmadd231ps_fma(auVar103,auVar117,auVar117);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar166 = auVar103._0_4_;
        fVar147 = auVar103._4_4_;
        fVar186 = auVar103._8_4_;
        fVar187 = auVar103._12_4_;
        fVar188 = auVar103._16_4_;
        fVar181 = auVar103._20_4_;
        fVar91 = auVar103._24_4_;
        auVar39._4_4_ = fVar147 * fVar147 * fVar147 * auVar94._4_4_ * -0.5;
        auVar39._0_4_ = fVar166 * fVar166 * fVar166 * auVar94._0_4_ * -0.5;
        auVar39._8_4_ = fVar186 * fVar186 * fVar186 * auVar94._8_4_ * -0.5;
        auVar39._12_4_ = fVar187 * fVar187 * fVar187 * auVar94._12_4_ * -0.5;
        auVar39._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar39._20_4_ = fVar181 * fVar181 * fVar181 * -0.0;
        auVar39._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar39._28_4_ = 0;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar115 = vfmadd231ps_avx512vl(auVar39,auVar101,auVar103);
        auVar40._4_4_ = auVar117._4_4_ * auVar115._4_4_;
        auVar40._0_4_ = auVar117._0_4_ * auVar115._0_4_;
        auVar40._8_4_ = auVar117._8_4_ * auVar115._8_4_;
        auVar40._12_4_ = auVar117._12_4_ * auVar115._12_4_;
        auVar40._16_4_ = auVar117._16_4_ * auVar115._16_4_;
        auVar40._20_4_ = auVar117._20_4_ * auVar115._20_4_;
        auVar40._24_4_ = auVar117._24_4_ * auVar115._24_4_;
        auVar40._28_4_ = auVar103._28_4_;
        auVar41._4_4_ = auVar115._4_4_ * -auVar116._4_4_;
        auVar41._0_4_ = auVar115._0_4_ * -auVar116._0_4_;
        auVar41._8_4_ = auVar115._8_4_ * -auVar116._8_4_;
        auVar41._12_4_ = auVar115._12_4_ * -auVar116._12_4_;
        auVar41._16_4_ = auVar115._16_4_ * -auVar116._16_4_;
        auVar41._20_4_ = auVar115._20_4_ * -auVar116._20_4_;
        auVar41._24_4_ = auVar115._24_4_ * -auVar116._24_4_;
        auVar41._28_4_ = auVar116._28_4_ ^ 0x80000000;
        auVar103 = vmulps_avx512vl(auVar115,ZEXT1632(auVar97));
        auVar109 = ZEXT1632(auVar97);
        auVar114 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar109);
        auVar94 = vfmadd231ps_fma(auVar114,auVar119,auVar119);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar166 = auVar114._0_4_;
        fVar147 = auVar114._4_4_;
        fVar186 = auVar114._8_4_;
        fVar187 = auVar114._12_4_;
        fVar188 = auVar114._16_4_;
        fVar181 = auVar114._20_4_;
        fVar91 = auVar114._24_4_;
        auVar42._4_4_ = fVar147 * fVar147 * fVar147 * auVar94._4_4_ * -0.5;
        auVar42._0_4_ = fVar166 * fVar166 * fVar166 * auVar94._0_4_ * -0.5;
        auVar42._8_4_ = fVar186 * fVar186 * fVar186 * auVar94._8_4_ * -0.5;
        auVar42._12_4_ = fVar187 * fVar187 * fVar187 * auVar94._12_4_ * -0.5;
        auVar42._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
        auVar42._20_4_ = fVar181 * fVar181 * fVar181 * -0.0;
        auVar42._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar42._28_4_ = 0;
        auVar101 = vfmadd231ps_avx512vl(auVar42,auVar101,auVar114);
        auVar43._4_4_ = auVar119._4_4_ * auVar101._4_4_;
        auVar43._0_4_ = auVar119._0_4_ * auVar101._0_4_;
        auVar43._8_4_ = auVar119._8_4_ * auVar101._8_4_;
        auVar43._12_4_ = auVar119._12_4_ * auVar101._12_4_;
        auVar43._16_4_ = auVar119._16_4_ * auVar101._16_4_;
        auVar43._20_4_ = auVar119._20_4_ * auVar101._20_4_;
        auVar43._24_4_ = auVar119._24_4_ * auVar101._24_4_;
        auVar43._28_4_ = auVar114._28_4_;
        auVar44._4_4_ = -auVar118._4_4_ * auVar101._4_4_;
        auVar44._0_4_ = -auVar118._0_4_ * auVar101._0_4_;
        auVar44._8_4_ = -auVar118._8_4_ * auVar101._8_4_;
        auVar44._12_4_ = -auVar118._12_4_ * auVar101._12_4_;
        auVar44._16_4_ = -auVar118._16_4_ * auVar101._16_4_;
        auVar44._20_4_ = -auVar118._20_4_ * auVar101._20_4_;
        auVar44._24_4_ = -auVar118._24_4_ * auVar101._24_4_;
        auVar44._28_4_ = auVar115._28_4_;
        auVar101 = vmulps_avx512vl(auVar101,auVar109);
        auVar94 = vfmadd213ps_fma(auVar40,auVar110,auVar106);
        auVar150 = vfmadd213ps_fma(auVar41,auVar110,auVar107);
        auVar115 = vfmadd213ps_avx512vl(auVar103,auVar110,auVar105);
        auVar114 = vfmadd213ps_avx512vl(auVar43,ZEXT1632(auVar151),auVar100);
        auVar96 = vfnmadd213ps_fma(auVar40,auVar110,auVar106);
        auVar113 = ZEXT1632(auVar151);
        auVar93 = vfmadd213ps_fma(auVar44,auVar113,auVar108);
        auVar24 = vfnmadd213ps_fma(auVar41,auVar110,auVar107);
        auVar9 = vfmadd213ps_fma(auVar101,auVar113,auVar102);
        auVar104 = vfnmadd231ps_avx512vl(auVar105,auVar110,auVar103);
        auVar159 = vfnmadd213ps_fma(auVar43,auVar113,auVar100);
        auVar167 = vfnmadd213ps_fma(auVar44,auVar113,auVar108);
        auVar168 = vfnmadd231ps_fma(auVar102,ZEXT1632(auVar151),auVar101);
        auVar101 = vsubps_avx512vl(auVar114,ZEXT1632(auVar96));
        auVar103 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar24));
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar9),auVar104);
        auVar105 = vmulps_avx512vl(auVar103,auVar104);
        auVar10 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar24),auVar102);
        auVar45._4_4_ = auVar96._4_4_ * auVar102._4_4_;
        auVar45._0_4_ = auVar96._0_4_ * auVar102._0_4_;
        auVar45._8_4_ = auVar96._8_4_ * auVar102._8_4_;
        auVar45._12_4_ = auVar96._12_4_ * auVar102._12_4_;
        auVar45._16_4_ = auVar102._16_4_ * 0.0;
        auVar45._20_4_ = auVar102._20_4_ * 0.0;
        auVar45._24_4_ = auVar102._24_4_ * 0.0;
        auVar45._28_4_ = auVar102._28_4_;
        auVar102 = vfmsub231ps_avx512vl(auVar45,auVar104,auVar101);
        auVar46._4_4_ = auVar24._4_4_ * auVar101._4_4_;
        auVar46._0_4_ = auVar24._0_4_ * auVar101._0_4_;
        auVar46._8_4_ = auVar24._8_4_ * auVar101._8_4_;
        auVar46._12_4_ = auVar24._12_4_ * auVar101._12_4_;
        auVar46._16_4_ = auVar101._16_4_ * 0.0;
        auVar46._20_4_ = auVar101._20_4_ * 0.0;
        auVar46._24_4_ = auVar101._24_4_ * 0.0;
        auVar46._28_4_ = auVar101._28_4_;
        auVar11 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar96),auVar103);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar109,auVar102);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,ZEXT1632(auVar10));
        auVar108 = ZEXT1632(auVar97);
        uVar83 = vcmpps_avx512vl(auVar103,auVar108,2);
        bVar16 = (byte)uVar83;
        fVar91 = (float)((uint)(bVar16 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar16 & 1) * auVar159._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar165 = (float)((uint)bVar17 * auVar94._4_4_ | (uint)!bVar17 * auVar159._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar140 = (float)((uint)bVar17 * auVar94._8_4_ | (uint)!bVar17 * auVar159._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar143 = (float)((uint)bVar17 * auVar94._12_4_ | (uint)!bVar17 * auVar159._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(fVar165,fVar91))));
        fVar92 = (float)((uint)(bVar16 & 1) * auVar150._0_4_ |
                        (uint)!(bool)(bVar16 & 1) * auVar167._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar139 = (float)((uint)bVar17 * auVar150._4_4_ | (uint)!bVar17 * auVar167._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar141 = (float)((uint)bVar17 * auVar150._8_4_ | (uint)!bVar17 * auVar167._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar144 = (float)((uint)bVar17 * auVar150._12_4_ | (uint)!bVar17 * auVar167._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar141,CONCAT44(fVar139,fVar92))));
        auVar120._0_4_ =
             (float)((uint)(bVar16 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar16 & 1) * auVar168._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar17 * auVar115._4_4_ | (uint)!bVar17 * auVar168._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar17 * auVar115._8_4_ | (uint)!bVar17 * auVar168._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar17 * auVar115._12_4_ | (uint)!bVar17 * auVar168._12_4_);
        fVar166 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_);
        auVar120._16_4_ = fVar166;
        fVar147 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_);
        auVar120._20_4_ = fVar147;
        fVar186 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_);
        auVar120._24_4_ = fVar186;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
        auVar120._28_4_ = iVar1;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar114);
        auVar121._0_4_ =
             (uint)(bVar16 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar10._0_4_;
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar10._4_4_;
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar10._8_4_;
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar10._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar101._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar101._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar101._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(ZEXT1632(auVar24),ZEXT1632(auVar93));
        auVar122._0_4_ =
             (float)((uint)(bVar16 & 1) * auVar101._0_4_ |
                    (uint)!(bool)(bVar16 & 1) * auVar150._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar150._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar150._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar150._12_4_);
        fVar187 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar101._16_4_);
        auVar122._16_4_ = fVar187;
        fVar188 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar101._20_4_);
        auVar122._20_4_ = fVar188;
        fVar181 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar101._24_4_);
        auVar122._24_4_ = fVar181;
        auVar122._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar101._28_4_;
        auVar101 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar9));
        auVar123._0_4_ =
             (float)((uint)(bVar16 & 1) * auVar101._0_4_ |
                    (uint)!(bool)(bVar16 & 1) * auVar115._0_4_);
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar115._4_4_);
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar115._8_4_);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar115._12_4_);
        bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * auVar115._16_4_);
        bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * auVar115._20_4_);
        bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * auVar115._24_4_);
        bVar17 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = (uint)bVar17 * auVar101._28_4_ | (uint)!bVar17 * auVar115._28_4_;
        auVar124._0_4_ =
             (uint)(bVar16 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar114._0_4_;
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar17 * (int)auVar96._4_4_ | (uint)!bVar17 * auVar114._4_4_;
        bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar17 * (int)auVar96._8_4_ | (uint)!bVar17 * auVar114._8_4_;
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar17 * (int)auVar96._12_4_ | (uint)!bVar17 * auVar114._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar114._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar114._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar114._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar114._28_4_;
        bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar16 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar9._0_4_;
        bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar9._4_4_;
        bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar9._8_4_;
        bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar9._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar104._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar104._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar104._28_4_;
        auVar125._28_4_ = iVar2;
        auVar106 = vsubps_avx512vl(auVar124,auVar105);
        auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar24._12_4_ |
                                                 (uint)!bVar20 * auVar93._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar24._8_4_ |
                                                          (uint)!bVar19 * auVar93._8_4_,
                                                          CONCAT44((uint)bVar17 * (int)auVar24._4_4_
                                                                   | (uint)!bVar17 * auVar93._4_4_,
                                                                   (uint)(bVar16 & 1) *
                                                                   (int)auVar24._0_4_ |
                                                                   (uint)!(bool)(bVar16 & 1) *
                                                                   auVar93._0_4_)))),auVar113);
        auVar115 = vsubps_avx(auVar125,auVar120);
        auVar114 = vsubps_avx(auVar105,auVar121);
        auVar104 = vsubps_avx(auVar113,auVar122);
        auVar102 = vsubps_avx(auVar120,auVar123);
        auVar47._4_4_ = auVar115._4_4_ * fVar165;
        auVar47._0_4_ = auVar115._0_4_ * fVar91;
        auVar47._8_4_ = auVar115._8_4_ * fVar140;
        auVar47._12_4_ = auVar115._12_4_ * fVar143;
        auVar47._16_4_ = auVar115._16_4_ * 0.0;
        auVar47._20_4_ = auVar115._20_4_ * 0.0;
        auVar47._24_4_ = auVar115._24_4_ * 0.0;
        auVar47._28_4_ = iVar2;
        auVar94 = vfmsub231ps_fma(auVar47,auVar120,auVar106);
        auVar48._4_4_ = fVar139 * auVar106._4_4_;
        auVar48._0_4_ = fVar92 * auVar106._0_4_;
        auVar48._8_4_ = fVar141 * auVar106._8_4_;
        auVar48._12_4_ = fVar144 * auVar106._12_4_;
        auVar48._16_4_ = auVar106._16_4_ * 0.0;
        auVar48._20_4_ = auVar106._20_4_ * 0.0;
        auVar48._24_4_ = auVar106._24_4_ * 0.0;
        auVar48._28_4_ = auVar103._28_4_;
        auVar150 = vfmsub231ps_fma(auVar48,auVar105,auVar101);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar150),auVar108,ZEXT1632(auVar94));
        auVar182._0_4_ = auVar101._0_4_ * auVar120._0_4_;
        auVar182._4_4_ = auVar101._4_4_ * auVar120._4_4_;
        auVar182._8_4_ = auVar101._8_4_ * auVar120._8_4_;
        auVar182._12_4_ = auVar101._12_4_ * auVar120._12_4_;
        auVar182._16_4_ = auVar101._16_4_ * fVar166;
        auVar182._20_4_ = auVar101._20_4_ * fVar147;
        auVar182._24_4_ = auVar101._24_4_ * fVar186;
        auVar182._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar182,auVar113,auVar115);
        auVar107 = vfmadd231ps_avx512vl(auVar103,auVar108,ZEXT1632(auVar94));
        auVar103 = vmulps_avx512vl(auVar102,auVar121);
        auVar103 = vfmsub231ps_avx512vl(auVar103,auVar114,auVar123);
        auVar49._4_4_ = auVar104._4_4_ * auVar123._4_4_;
        auVar49._0_4_ = auVar104._0_4_ * auVar123._0_4_;
        auVar49._8_4_ = auVar104._8_4_ * auVar123._8_4_;
        auVar49._12_4_ = auVar104._12_4_ * auVar123._12_4_;
        auVar49._16_4_ = auVar104._16_4_ * auVar123._16_4_;
        auVar49._20_4_ = auVar104._20_4_ * auVar123._20_4_;
        auVar49._24_4_ = auVar104._24_4_ * auVar123._24_4_;
        auVar49._28_4_ = auVar123._28_4_;
        auVar94 = vfmsub231ps_fma(auVar49,auVar122,auVar102);
        auVar183._0_4_ = auVar122._0_4_ * auVar114._0_4_;
        auVar183._4_4_ = auVar122._4_4_ * auVar114._4_4_;
        auVar183._8_4_ = auVar122._8_4_ * auVar114._8_4_;
        auVar183._12_4_ = auVar122._12_4_ * auVar114._12_4_;
        auVar183._16_4_ = fVar187 * auVar114._16_4_;
        auVar183._20_4_ = fVar188 * auVar114._20_4_;
        auVar183._24_4_ = fVar181 * auVar114._24_4_;
        auVar183._28_4_ = 0;
        auVar150 = vfmsub231ps_fma(auVar183,auVar104,auVar121);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar150),auVar108,auVar103);
        auVar100 = vfmadd231ps_avx512vl(auVar103,auVar108,ZEXT1632(auVar94));
        auVar103 = vmaxps_avx(auVar107,auVar100);
        uVar149 = vcmpps_avx512vl(auVar103,auVar108,2);
        bVar90 = bVar90 & (byte)uVar149;
        in_ZMM20 = ZEXT3264(local_440);
        in_ZMM21 = ZEXT3264(local_460);
        auVar215 = ZEXT3264(local_3e0);
        if (bVar90 == 0) {
          bVar90 = 0;
          auVar197 = ZEXT3264(local_580);
          auVar180 = ZEXT3264(local_5e0);
        }
        else {
          auVar50._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar50._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar50._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar50._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar50._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar50._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar50._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar50._28_4_ = auVar103._28_4_;
          auVar93 = vfmsub231ps_fma(auVar50,auVar104,auVar115);
          auVar51._4_4_ = auVar115._4_4_ * auVar114._4_4_;
          auVar51._0_4_ = auVar115._0_4_ * auVar114._0_4_;
          auVar51._8_4_ = auVar115._8_4_ * auVar114._8_4_;
          auVar51._12_4_ = auVar115._12_4_ * auVar114._12_4_;
          auVar51._16_4_ = auVar115._16_4_ * auVar114._16_4_;
          auVar51._20_4_ = auVar115._20_4_ * auVar114._20_4_;
          auVar51._24_4_ = auVar115._24_4_ * auVar114._24_4_;
          auVar51._28_4_ = auVar115._28_4_;
          auVar150 = vfmsub231ps_fma(auVar51,auVar106,auVar102);
          auVar52._4_4_ = auVar104._4_4_ * auVar106._4_4_;
          auVar52._0_4_ = auVar104._0_4_ * auVar106._0_4_;
          auVar52._8_4_ = auVar104._8_4_ * auVar106._8_4_;
          auVar52._12_4_ = auVar104._12_4_ * auVar106._12_4_;
          auVar52._16_4_ = auVar104._16_4_ * auVar106._16_4_;
          auVar52._20_4_ = auVar104._20_4_ * auVar106._20_4_;
          auVar52._24_4_ = auVar104._24_4_ * auVar106._24_4_;
          auVar52._28_4_ = auVar104._28_4_;
          auVar9 = vfmsub231ps_fma(auVar52,auVar114,auVar101);
          auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar150),ZEXT1632(auVar9));
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar93),auVar108);
          auVar101 = vrcp14ps_avx512vl(auVar103);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar115 = vfnmadd213ps_avx512vl(auVar101,auVar103,auVar28);
          auVar94 = vfmadd132ps_fma(auVar115,auVar101,auVar101);
          auVar53._4_4_ = auVar9._4_4_ * auVar120._4_4_;
          auVar53._0_4_ = auVar9._0_4_ * auVar120._0_4_;
          auVar53._8_4_ = auVar9._8_4_ * auVar120._8_4_;
          auVar53._12_4_ = auVar9._12_4_ * auVar120._12_4_;
          auVar53._16_4_ = fVar166 * 0.0;
          auVar53._20_4_ = fVar147 * 0.0;
          auVar53._24_4_ = fVar186 * 0.0;
          auVar53._28_4_ = iVar1;
          auVar150 = vfmadd231ps_fma(auVar53,auVar113,ZEXT1632(auVar150));
          auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar105,ZEXT1632(auVar93));
          fVar147 = auVar94._0_4_;
          fVar186 = auVar94._4_4_;
          fVar187 = auVar94._8_4_;
          fVar188 = auVar94._12_4_;
          auVar101 = ZEXT1632(CONCAT412(auVar150._12_4_ * fVar188,
                                        CONCAT48(auVar150._8_4_ * fVar187,
                                                 CONCAT44(auVar150._4_4_ * fVar186,
                                                          auVar150._0_4_ * fVar147))));
          auVar199._4_4_ = uVar204;
          auVar199._0_4_ = uVar204;
          auVar199._8_4_ = uVar204;
          auVar199._12_4_ = uVar204;
          auVar199._16_4_ = uVar204;
          auVar199._20_4_ = uVar204;
          auVar199._24_4_ = uVar204;
          auVar199._28_4_ = uVar204;
          uVar149 = vcmpps_avx512vl(auVar199,auVar101,2);
          fVar166 = (ray->super_RayK<1>).tfar;
          auVar29._4_4_ = fVar166;
          auVar29._0_4_ = fVar166;
          auVar29._8_4_ = fVar166;
          auVar29._12_4_ = fVar166;
          auVar29._16_4_ = fVar166;
          auVar29._20_4_ = fVar166;
          auVar29._24_4_ = fVar166;
          auVar29._28_4_ = fVar166;
          uVar25 = vcmpps_avx512vl(auVar101,auVar29,2);
          bVar90 = (byte)uVar149 & (byte)uVar25 & bVar90;
          if (bVar90 == 0) {
            bVar90 = 0;
            auVar197 = ZEXT3264(local_580);
            auVar180 = ZEXT3264(local_5e0);
          }
          else {
            uVar149 = vcmpps_avx512vl(auVar103,auVar108,4);
            if ((bVar90 & (byte)uVar149) == 0) {
              bVar90 = 0;
              auVar197 = ZEXT3264(local_580);
              auVar180 = ZEXT3264(local_5e0);
            }
            else {
              bVar90 = bVar90 & (byte)uVar149;
              fVar166 = auVar107._0_4_ * fVar147;
              fVar181 = auVar107._4_4_ * fVar186;
              auVar54._4_4_ = fVar181;
              auVar54._0_4_ = fVar166;
              fVar91 = auVar107._8_4_ * fVar187;
              auVar54._8_4_ = fVar91;
              fVar92 = auVar107._12_4_ * fVar188;
              auVar54._12_4_ = fVar92;
              fVar165 = auVar107._16_4_ * 0.0;
              auVar54._16_4_ = fVar165;
              fVar139 = auVar107._20_4_ * 0.0;
              auVar54._20_4_ = fVar139;
              fVar140 = auVar107._24_4_ * 0.0;
              auVar54._24_4_ = fVar140;
              auVar54._28_4_ = auVar107._28_4_;
              fVar147 = auVar100._0_4_ * fVar147;
              fVar186 = auVar100._4_4_ * fVar186;
              auVar55._4_4_ = fVar186;
              auVar55._0_4_ = fVar147;
              fVar187 = auVar100._8_4_ * fVar187;
              auVar55._8_4_ = fVar187;
              fVar188 = auVar100._12_4_ * fVar188;
              auVar55._12_4_ = fVar188;
              fVar141 = auVar100._16_4_ * 0.0;
              auVar55._16_4_ = fVar141;
              fVar143 = auVar100._20_4_ * 0.0;
              auVar55._20_4_ = fVar143;
              fVar144 = auVar100._24_4_ * 0.0;
              auVar55._24_4_ = fVar144;
              auVar55._28_4_ = auVar100._28_4_;
              auVar193._8_4_ = 0x3f800000;
              auVar193._0_8_ = &DAT_3f8000003f800000;
              auVar193._12_4_ = 0x3f800000;
              auVar193._16_4_ = 0x3f800000;
              auVar193._20_4_ = 0x3f800000;
              auVar193._24_4_ = 0x3f800000;
              auVar193._28_4_ = 0x3f800000;
              auVar103 = vsubps_avx(auVar193,auVar54);
              bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar21 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar22 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar23 = SUB81(uVar83 >> 7,0);
              auVar197 = ZEXT3264(CONCAT428((uint)bVar23 * auVar107._28_4_ |
                                            (uint)!bVar23 * auVar103._28_4_,
                                            CONCAT424((uint)bVar22 * (int)fVar140 |
                                                      (uint)!bVar22 * auVar103._24_4_,
                                                      CONCAT420((uint)bVar21 * (int)fVar139 |
                                                                (uint)!bVar21 * auVar103._20_4_,
                                                                CONCAT416((uint)bVar20 *
                                                                          (int)fVar165 |
                                                                          (uint)!bVar20 *
                                                                          auVar103._16_4_,
                                                                          CONCAT412((uint)bVar19 *
                                                                                    (int)fVar92 |
                                                                                    (uint)!bVar19 *
                                                                                    auVar103._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar18 * (int)fVar91 |
                                                  (uint)!bVar18 * auVar103._8_4_,
                                                  CONCAT44((uint)bVar17 * (int)fVar181 |
                                                           (uint)!bVar17 * auVar103._4_4_,
                                                           (uint)(bVar16 & 1) * (int)fVar166 |
                                                           (uint)!(bool)(bVar16 & 1) *
                                                           auVar103._0_4_))))))));
              auVar103 = vsubps_avx(auVar193,auVar55);
              bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar21 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar22 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar23 = SUB81(uVar83 >> 7,0);
              local_220._4_4_ = (uint)bVar17 * (int)fVar186 | (uint)!bVar17 * auVar103._4_4_;
              local_220._0_4_ =
                   (uint)(bVar16 & 1) * (int)fVar147 | (uint)!(bool)(bVar16 & 1) * auVar103._0_4_;
              local_220._8_4_ = (uint)bVar18 * (int)fVar187 | (uint)!bVar18 * auVar103._8_4_;
              local_220._12_4_ = (uint)bVar19 * (int)fVar188 | (uint)!bVar19 * auVar103._12_4_;
              local_220._16_4_ = (uint)bVar20 * (int)fVar141 | (uint)!bVar20 * auVar103._16_4_;
              local_220._20_4_ = (uint)bVar21 * (int)fVar143 | (uint)!bVar21 * auVar103._20_4_;
              local_220._24_4_ = (uint)bVar22 * (int)fVar144 | (uint)!bVar22 * auVar103._24_4_;
              local_220._28_4_ = (uint)bVar23 * auVar100._28_4_ | (uint)!bVar23 * auVar103._28_4_;
              auVar180 = ZEXT3264(auVar101);
            }
          }
        }
        auVar219 = ZEXT3264(local_4a0);
        auVar218 = ZEXT3264(local_480);
        auVar203 = ZEXT1664(local_600);
        if (bVar90 != 0) {
          auVar103 = vsubps_avx(ZEXT1632(auVar151),auVar110);
          local_360 = auVar197._0_32_;
          auVar94 = vfmadd213ps_fma(auVar103,local_360,auVar110);
          fVar166 = pre->depth_scale;
          auVar30._4_4_ = fVar166;
          auVar30._0_4_ = fVar166;
          auVar30._8_4_ = fVar166;
          auVar30._12_4_ = fVar166;
          auVar30._16_4_ = fVar166;
          auVar30._20_4_ = fVar166;
          auVar30._24_4_ = fVar166;
          auVar30._28_4_ = fVar166;
          auVar103 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                        CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                 CONCAT44(auVar94._4_4_ +
                                                                          auVar94._4_4_,
                                                                          auVar94._0_4_ +
                                                                          auVar94._0_4_)))),auVar30)
          ;
          local_320 = auVar180._0_32_;
          uVar149 = vcmpps_avx512vl(local_320,auVar103,6);
          bVar90 = bVar90 & (byte)uVar149;
          if (bVar90 != 0) {
            auVar152._8_4_ = 0xbf800000;
            auVar152._0_8_ = 0xbf800000bf800000;
            auVar152._12_4_ = 0xbf800000;
            auVar152._16_4_ = 0xbf800000;
            auVar152._20_4_ = 0xbf800000;
            auVar152._24_4_ = 0xbf800000;
            auVar152._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_220 = vfmadd132ps_avx512vl(local_220,auVar152,auVar31);
            auVar103 = local_220;
            local_340 = local_220;
            local_300 = 0;
            local_2fc = iVar13;
            local_2f0 = local_600;
            local_2e0 = local_550;
            uStack_2d8 = uStack_548;
            local_2d0 = local_560;
            uStack_2c8 = uStack_558;
            local_2b0 = bVar90;
            local_220 = auVar103;
            if ((pGVar14->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar166 = 1.0 / (float)local_380._0_4_;
              local_2a0[0] = fVar166 * (auVar197._0_4_ + 0.0);
              local_2a0[1] = fVar166 * (auVar197._4_4_ + 1.0);
              local_2a0[2] = fVar166 * (auVar197._8_4_ + 2.0);
              local_2a0[3] = fVar166 * (auVar197._12_4_ + 3.0);
              fStack_290 = fVar166 * (auVar197._16_4_ + 4.0);
              fStack_28c = fVar166 * (auVar197._20_4_ + 5.0);
              fStack_288 = fVar166 * (auVar197._24_4_ + 6.0);
              fStack_284 = auVar197._28_4_ + 7.0;
              local_280 = local_220._0_8_;
              uStack_278 = local_220._8_8_;
              uStack_270 = local_220._16_8_;
              uStack_268 = local_220._24_8_;
              local_260 = local_320;
              auVar153._8_4_ = 0x7f800000;
              auVar153._0_8_ = 0x7f8000007f800000;
              auVar153._12_4_ = 0x7f800000;
              auVar153._16_4_ = 0x7f800000;
              auVar153._20_4_ = 0x7f800000;
              auVar153._24_4_ = 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar101 = vblendmps_avx512vl(auVar153,local_320);
              auVar126._0_4_ =
                   (uint)(bVar90 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
              bVar17 = (bool)(bVar90 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar90 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar90 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar90 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar90 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar90 >> 6 & 1);
              auVar126._24_4_ = (uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * 0x7f800000;
              auVar126._28_4_ =
                   (uint)(bVar90 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
              auVar101 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar101 = vminps_avx(auVar126,auVar101);
              auVar115 = vshufpd_avx(auVar101,auVar101,5);
              auVar101 = vminps_avx(auVar101,auVar115);
              auVar115 = vpermpd_avx2(auVar101,0x4e);
              auVar101 = vminps_avx(auVar101,auVar115);
              uVar149 = vcmpps_avx512vl(auVar126,auVar101,0);
              bVar82 = (byte)uVar149 & bVar90;
              bVar16 = bVar90;
              if (bVar82 != 0) {
                bVar16 = bVar82;
              }
              uVar26 = 0;
              for (uVar84 = (uint)bVar16; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                uVar26 = uVar26 + 1;
              }
              uVar83 = (ulong)uVar26;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar166 = local_2a0[uVar83];
                fVar147 = *(float *)((long)&local_280 + uVar83 * 4);
                fVar186 = 1.0 - fVar166;
                auVar93 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar186 + fVar186))),
                                           ZEXT416((uint)fVar186),ZEXT416((uint)fVar186));
                auVar150 = ZEXT416((uint)fVar166);
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,
                                          ZEXT416(0xc0a00000));
                auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                           ZEXT416((uint)(fVar166 + fVar166)),auVar94);
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar150,
                                          ZEXT416(0x40000000));
                auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar186 * fVar186 * -3.0)),
                                          ZEXT416((uint)(fVar186 + fVar186)),auVar94);
                auVar150 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar150,
                                           ZEXT416((uint)(fVar186 * -2.0)));
                fVar186 = auVar93._0_4_ * 0.5;
                fVar187 = auVar151._0_4_ * 0.5;
                fVar188 = auVar94._0_4_ * 0.5;
                fVar181 = auVar150._0_4_ * 0.5;
                auVar169._0_4_ = fVar181 * local_540;
                auVar169._4_4_ = fVar181 * fStack_53c;
                auVar169._8_4_ = fVar181 * fStack_538;
                auVar169._12_4_ = fVar181 * fStack_534;
                auVar189._4_4_ = fVar188;
                auVar189._0_4_ = fVar188;
                auVar189._8_4_ = fVar188;
                auVar189._12_4_ = fVar188;
                auVar94 = vfmadd132ps_fma(auVar189,auVar169,*pauVar4);
                auVar170._4_4_ = fVar187;
                auVar170._0_4_ = fVar187;
                auVar170._8_4_ = fVar187;
                auVar170._12_4_ = fVar187;
                auVar94 = vfmadd132ps_fma(auVar170,auVar94,*pauVar3);
                auVar197 = ZEXT3264(local_360);
                auVar160._4_4_ = fVar186;
                auVar160._0_4_ = fVar186;
                auVar160._8_4_ = fVar186;
                auVar160._12_4_ = fVar186;
                (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar83 * 4);
                auVar94 = vfmadd213ps_fma(auVar160,local_600,auVar94);
                auVar180 = ZEXT3264(local_320);
                uVar149 = vmovlps_avx(auVar94);
                *(undefined8 *)&(ray->Ng).field_0 = uVar149;
                fVar186 = (float)vextractps_avx(auVar94,2);
                (ray->Ng).field_0.field_0.z = fVar186;
                ray->u = fVar166;
                ray->v = fVar147;
                ray->primID = uVar85;
                ray->geomID = uVar88;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_410 = (float)local_550;
                uStack_40c = (undefined4)((ulong)local_550 >> 0x20);
                uStack_408 = uStack_548;
                local_4b0 = (Geometry *)local_560;
                uStack_4a8 = uStack_558;
                local_610 = prim;
                local_618 = context;
                local_620 = pre;
                local_580 = local_360;
                local_5e0 = local_320;
                local_420 = local_540;
                fStack_41c = fStack_53c;
                fStack_418 = fStack_538;
                fStack_414 = fStack_534;
                do {
                  auVar93 = auVar216._0_16_;
                  local_524 = local_2a0[uVar83];
                  local_520 = *(undefined4 *)((long)&local_280 + uVar83 * 4);
                  fVar166 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar83 * 4);
                  local_5b0.context = context->user;
                  fVar147 = 1.0 - local_524;
                  auVar150 = vfnmadd231ss_fma(ZEXT416((uint)(local_524 * (fVar147 + fVar147))),
                                              ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
                  auVar151 = ZEXT416((uint)local_524);
                  auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar151,
                                            ZEXT416(0xc0a00000));
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524 * 3.0)),
                                            ZEXT416((uint)(local_524 + local_524)),auVar95);
                  auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar151,
                                            ZEXT416(0x40000000));
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar147 * fVar147 * -3.0)),
                                            ZEXT416((uint)(fVar147 + fVar147)),auVar95);
                  auVar151 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524)),auVar151,
                                             ZEXT416((uint)(fVar147 * -2.0)));
                  fVar147 = auVar150._0_4_ * 0.5;
                  fVar186 = auVar94._0_4_ * 0.5;
                  fVar187 = auVar95._0_4_ * 0.5;
                  fVar188 = auVar151._0_4_ * 0.5;
                  auVar175._0_4_ = fVar188 * local_420;
                  auVar175._4_4_ = fVar188 * fStack_41c;
                  auVar175._8_4_ = fVar188 * fStack_418;
                  auVar175._12_4_ = fVar188 * fStack_414;
                  auVar192._4_4_ = fVar187;
                  auVar192._0_4_ = fVar187;
                  auVar192._8_4_ = fVar187;
                  auVar192._12_4_ = fVar187;
                  auVar77._8_8_ = uStack_4a8;
                  auVar77._0_8_ = local_4b0;
                  auVar95 = vfmadd132ps_fma(auVar192,auVar175,auVar77);
                  auVar176._4_4_ = fVar186;
                  auVar176._0_4_ = fVar186;
                  auVar176._8_4_ = fVar186;
                  auVar176._12_4_ = fVar186;
                  auVar79._4_4_ = uStack_40c;
                  auVar79._0_4_ = local_410;
                  auVar79._8_8_ = uStack_408;
                  auVar95 = vfmadd132ps_fma(auVar176,auVar95,auVar79);
                  auVar163._4_4_ = fVar147;
                  auVar163._0_4_ = fVar147;
                  auVar163._8_4_ = fVar147;
                  auVar163._12_4_ = fVar147;
                  auVar95 = vfmadd213ps_fma(auVar163,auVar203._0_16_,auVar95);
                  local_530 = vmovlps_avx(auVar95);
                  local_528 = vextractps_avx(auVar95,2);
                  local_51c = (int)local_5e8;
                  local_518 = (int)local_608;
                  local_514 = (local_5b0.context)->instID[0];
                  local_510 = (local_5b0.context)->instPrimID[0];
                  local_624 = -1;
                  local_5b0.valid = &local_624;
                  local_5b0.geometryUserPtr = pGVar14->userPtr;
                  local_5b0.ray = (RTCRayN *)ray;
                  local_5b0.hit = (RTCHitN *)&local_530;
                  local_5b0.N = 1;
                  local_3a0 = (uint)uVar83;
                  uStack_39c = (uint)(uVar83 >> 0x20);
                  if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01dbd0bf:
                    auVar95 = auVar216._0_16_;
                    p_Var15 = context->args->filter;
                    if (p_Var15 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var15)(&local_5b0);
                        uVar83 = CONCAT44(uStack_39c,local_3a0);
                        auVar217 = ZEXT1664(local_3c0._0_16_);
                        auVar219 = ZEXT3264(local_4a0);
                        auVar218 = ZEXT3264(local_480);
                        auVar214 = ZEXT3264(local_500);
                        auVar213 = ZEXT3264(local_4e0);
                        auVar215 = ZEXT3264(local_3e0);
                        auVar203 = ZEXT1664(local_600);
                        in_ZMM21 = ZEXT3264(local_460);
                        in_ZMM20 = ZEXT3264(local_440);
                        auVar95 = vxorps_avx512vl(auVar95,auVar95);
                        auVar216 = ZEXT1664(auVar95);
                        context = local_618;
                        prim = local_610;
                        pre = local_620;
                        uVar204 = local_400._0_4_;
                      }
                      if (*local_5b0.valid == 0) goto LAB_01dbd1cc;
                    }
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5b0.hit;
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5b0.hit + 4);
                    (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5b0.hit + 8);
                    *(float *)((long)local_5b0.ray + 0x3c) = *(float *)(local_5b0.hit + 0xc);
                    *(float *)((long)local_5b0.ray + 0x40) = *(float *)(local_5b0.hit + 0x10);
                    *(float *)((long)local_5b0.ray + 0x44) = *(float *)(local_5b0.hit + 0x14);
                    *(float *)((long)local_5b0.ray + 0x48) = *(float *)(local_5b0.hit + 0x18);
                    *(float *)((long)local_5b0.ray + 0x4c) = *(float *)(local_5b0.hit + 0x1c);
                    *(float *)((long)local_5b0.ray + 0x50) = *(float *)(local_5b0.hit + 0x20);
                  }
                  else {
                    (*pGVar14->intersectionFilterN)(&local_5b0);
                    uVar83 = CONCAT44(uStack_39c,local_3a0);
                    auVar217 = ZEXT1664(local_3c0._0_16_);
                    auVar219 = ZEXT3264(local_4a0);
                    auVar218 = ZEXT3264(local_480);
                    auVar214 = ZEXT3264(local_500);
                    auVar213 = ZEXT3264(local_4e0);
                    auVar215 = ZEXT3264(local_3e0);
                    auVar203 = ZEXT1664(local_600);
                    in_ZMM21 = ZEXT3264(local_460);
                    in_ZMM20 = ZEXT3264(local_440);
                    auVar95 = vxorps_avx512vl(auVar93,auVar93);
                    auVar216 = ZEXT1664(auVar95);
                    context = local_618;
                    prim = local_610;
                    pre = local_620;
                    uVar204 = local_400._0_4_;
                    if (*local_5b0.valid != 0) goto LAB_01dbd0bf;
LAB_01dbd1cc:
                    (ray->super_RayK<1>).tfar = fVar166;
                  }
                  auVar95 = auVar217._0_16_;
                  auVar180 = ZEXT3264(local_5e0);
                  bVar16 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & bVar90;
                  fVar166 = (ray->super_RayK<1>).tfar;
                  auVar38._4_4_ = fVar166;
                  auVar38._0_4_ = fVar166;
                  auVar38._8_4_ = fVar166;
                  auVar38._12_4_ = fVar166;
                  auVar38._16_4_ = fVar166;
                  auVar38._20_4_ = fVar166;
                  auVar38._24_4_ = fVar166;
                  auVar38._28_4_ = fVar166;
                  uVar149 = vcmpps_avx512vl(local_5e0,auVar38,2);
                  bVar90 = bVar16 & (byte)uVar149;
                  auVar197 = ZEXT3264(local_580);
                  if ((bVar16 & (byte)uVar149) != 0) {
                    auVar158._8_4_ = 0x7f800000;
                    auVar158._0_8_ = 0x7f8000007f800000;
                    auVar158._12_4_ = 0x7f800000;
                    auVar158._16_4_ = 0x7f800000;
                    auVar158._20_4_ = 0x7f800000;
                    auVar158._24_4_ = 0x7f800000;
                    auVar158._28_4_ = 0x7f800000;
                    auVar103 = vblendmps_avx512vl(auVar158,local_5e0);
                    auVar138._0_4_ =
                         (uint)(bVar90 & 1) * auVar103._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                    bVar17 = (bool)(bVar90 >> 1 & 1);
                    auVar138._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar90 >> 2 & 1);
                    auVar138._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar90 >> 3 & 1);
                    auVar138._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar90 >> 4 & 1);
                    auVar138._16_4_ = (uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar90 >> 5 & 1);
                    auVar138._20_4_ = (uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar90 >> 6 & 1);
                    auVar138._24_4_ = (uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar138._28_4_ =
                         (uint)(bVar90 >> 7) * auVar103._28_4_ |
                         (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                    auVar103 = vshufps_avx(auVar138,auVar138,0xb1);
                    auVar103 = vminps_avx(auVar138,auVar103);
                    auVar101 = vshufpd_avx(auVar103,auVar103,5);
                    auVar103 = vminps_avx(auVar103,auVar101);
                    auVar101 = vpermpd_avx2(auVar103,0x4e);
                    auVar103 = vminps_avx(auVar103,auVar101);
                    uVar149 = vcmpps_avx512vl(auVar138,auVar103,0);
                    bVar82 = (byte)uVar149 & bVar90;
                    bVar16 = bVar90;
                    if (bVar82 != 0) {
                      bVar16 = bVar82;
                    }
                    uVar88 = 0;
                    for (uVar85 = (uint)bVar16; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000
                        ) {
                      uVar88 = uVar88 + 1;
                    }
                    uVar83 = (ulong)uVar88;
                  }
                } while (bVar90 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar13) {
        local_3c0 = vpbroadcastd_avx512vl();
        local_400 = vbroadcastss_avx512vl(auVar95);
        local_3a0 = uVar204;
        uStack_39c = uVar204;
        uStack_398 = uVar204;
        uStack_394 = uVar204;
        uStack_390 = uVar204;
        uStack_38c = uVar204;
        uStack_388 = uVar204;
        uStack_384 = uVar204;
        local_380._4_4_ = 1.0 / (float)local_380._0_4_;
        local_380._0_4_ = local_380._4_4_;
        fStack_378 = (float)local_380._4_4_;
        fStack_374 = (float)local_380._4_4_;
        fStack_370 = (float)local_380._4_4_;
        fStack_36c = (float)local_380._4_4_;
        fStack_368 = (float)local_380._4_4_;
        fStack_364 = (float)local_380._4_4_;
        lVar86 = 8;
        local_580 = auVar197._0_32_;
        local_5e0 = auVar180._0_32_;
        do {
          auVar103 = vpbroadcastd_avx512vl();
          auVar104 = vpor_avx2(auVar103,_DAT_0205a920);
          uVar25 = vpcmpd_avx512vl(auVar104,local_3c0,1);
          auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar86 * 4 + lVar27);
          auVar101 = *(undefined1 (*) [32])(lVar27 + 0x22307f0 + lVar86 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2230c74 + lVar86 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar27 + 0x22310f8 + lVar86 * 4);
          local_480 = auVar218._0_32_;
          auVar102 = vmulps_avx512vl(local_480,auVar114);
          local_4a0 = auVar219._0_32_;
          auVar105 = vmulps_avx512vl(local_4a0,auVar114);
          auVar56._4_4_ = auVar114._4_4_ * (float)local_140._4_4_;
          auVar56._0_4_ = auVar114._0_4_ * (float)local_140._0_4_;
          auVar56._8_4_ = auVar114._8_4_ * fStack_138;
          auVar56._12_4_ = auVar114._12_4_ * fStack_134;
          auVar56._16_4_ = auVar114._16_4_ * fStack_130;
          auVar56._20_4_ = auVar114._20_4_ * fStack_12c;
          auVar56._24_4_ = auVar114._24_4_ * fStack_128;
          auVar56._28_4_ = auVar104._28_4_;
          auVar104 = vfmadd231ps_avx512vl(auVar102,auVar115,local_e0);
          auVar102 = vfmadd231ps_avx512vl(auVar105,auVar115,local_100);
          auVar105 = vfmadd231ps_avx512vl(auVar56,auVar115,local_120);
          auVar164 = auVar214._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar164);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar101,local_1e0);
          auVar95 = vfmadd231ps_fma(auVar105,auVar101,local_c0);
          auVar195 = auVar215._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar195);
          auVar112 = auVar213._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar102,auVar103,auVar112);
          auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar86 * 4 + lVar27);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x2232c10 + lVar86 * 4);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar103,local_a0);
          auVar105 = *(undefined1 (*) [32])(lVar27 + 0x2233094 + lVar86 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar27 + 0x2233518 + lVar86 * 4);
          auVar106 = vmulps_avx512vl(local_480,auVar113);
          auVar107 = vmulps_avx512vl(local_4a0,auVar113);
          auVar57._4_4_ = auVar113._4_4_ * (float)local_140._4_4_;
          auVar57._0_4_ = auVar113._0_4_ * (float)local_140._0_4_;
          auVar57._8_4_ = auVar113._8_4_ * fStack_138;
          auVar57._12_4_ = auVar113._12_4_ * fStack_134;
          auVar57._16_4_ = auVar113._16_4_ * fStack_130;
          auVar57._20_4_ = auVar113._20_4_ * fStack_12c;
          auVar57._24_4_ = auVar113._24_4_ * fStack_128;
          auVar57._28_4_ = uStack_124;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_e0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,local_100);
          auVar109 = vfmadd231ps_avx512vl(auVar57,auVar105,local_120);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar164);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,local_1e0);
          auVar94 = vfmadd231ps_fma(auVar109,auVar102,local_c0);
          auVar109 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar195);
          auVar98 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar112);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar104,local_a0);
          auVar99 = vmaxps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar94));
          auVar106 = vsubps_avx(auVar109,auVar100);
          auVar107 = vsubps_avx(auVar98,auVar108);
          auVar110 = vmulps_avx512vl(auVar108,auVar106);
          auVar111 = vmulps_avx512vl(auVar100,auVar107);
          auVar110 = vsubps_avx512vl(auVar110,auVar111);
          auVar111 = vmulps_avx512vl(auVar107,auVar107);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,auVar106);
          auVar99 = vmulps_avx512vl(auVar99,auVar99);
          auVar99 = vmulps_avx512vl(auVar99,auVar111);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          uVar149 = vcmpps_avx512vl(auVar110,auVar99,2);
          bVar90 = (byte)uVar25 & (byte)uVar149;
          if (bVar90 == 0) {
            auVar197 = ZEXT3264(local_580);
            auVar180 = ZEXT3264(local_5e0);
            auVar213 = ZEXT3264(auVar112);
            auVar214 = ZEXT3264(auVar164);
          }
          else {
            auVar113 = vmulps_avx512vl(local_1c0,auVar113);
            auVar105 = vfmadd213ps_avx512vl(auVar105,local_1a0,auVar113);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_180,auVar105);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_160,auVar102);
            auVar114 = vmulps_avx512vl(local_1c0,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_1a0,auVar114);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_180,auVar115);
            auVar102 = vfmadd213ps_avx512vl(auVar103,local_160,auVar101);
            auVar103 = *(undefined1 (*) [32])(lVar27 + 0x223157c + lVar86 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar27 + 0x2231a00 + lVar86 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2231e84 + lVar86 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar27 + 0x2232308 + lVar86 * 4);
            auVar105 = vmulps_avx512vl(local_480,auVar114);
            auVar113 = vmulps_avx512vl(local_4a0,auVar114);
            auVar114 = vmulps_avx512vl(local_1c0,auVar114);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_e0);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_100);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar164);
            auVar105 = vfmadd231ps_avx512vl(auVar113,auVar101,local_1e0);
            auVar101 = vfmadd231ps_avx512vl(auVar115,local_180,auVar101);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar103,auVar195);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar112);
            auVar113 = vfmadd231ps_avx512vl(auVar101,local_160,auVar103);
            auVar103 = *(undefined1 (*) [32])(lVar27 + 0x223399c + lVar86 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar27 + 0x22342a4 + lVar86 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2234728 + lVar86 * 4);
            auVar99 = vmulps_avx512vl(local_480,auVar115);
            auVar110 = vmulps_avx512vl(local_4a0,auVar115);
            auVar115 = vmulps_avx512vl(local_1c0,auVar115);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_e0);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,local_100);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_1a0,auVar101);
            auVar101 = *(undefined1 (*) [32])(lVar27 + 0x2233e20 + lVar86 * 4);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar164);
            auVar151 = vfmadd231ps_fma(auVar110,auVar101,local_1e0);
            auVar101 = vfmadd231ps_avx512vl(auVar115,local_180,auVar101);
            auVar115 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar195);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar151),auVar103,auVar112);
            auVar101 = vfmadd231ps_avx512vl(auVar101,local_160,auVar103);
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar114,auVar110);
            vandps_avx512vl(auVar105,auVar110);
            auVar103 = vmaxps_avx(auVar110,auVar110);
            vandps_avx512vl(auVar113,auVar110);
            auVar103 = vmaxps_avx(auVar103,auVar110);
            uVar83 = vcmpps_avx512vl(auVar103,local_400,1);
            bVar17 = (bool)((byte)uVar83 & 1);
            auVar127._0_4_ = (float)((uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar114._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar114._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar114._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar114._12_4_);
            bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * auVar114._16_4_);
            bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * auVar114._20_4_);
            bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * auVar114._24_4_);
            bVar17 = SUB81(uVar83 >> 7,0);
            auVar127._28_4_ = (uint)bVar17 * auVar106._28_4_ | (uint)!bVar17 * auVar114._28_4_;
            bVar17 = (bool)((byte)uVar83 & 1);
            auVar128._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar105._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar105._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar105._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar105._12_4_);
            bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar105._16_4_);
            bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar105._20_4_);
            bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar105._24_4_);
            bVar17 = SUB81(uVar83 >> 7,0);
            auVar128._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar105._28_4_;
            vandps_avx512vl(auVar115,auVar110);
            vandps_avx512vl(auVar99,auVar110);
            auVar103 = vmaxps_avx(auVar128,auVar128);
            vandps_avx512vl(auVar101,auVar110);
            auVar103 = vmaxps_avx(auVar103,auVar128);
            uVar83 = vcmpps_avx512vl(auVar103,local_400,1);
            bVar17 = (bool)((byte)uVar83 & 1);
            auVar129._0_4_ = (uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar115._0_4_;
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar115._4_4_;
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar115._8_4_;
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar115._12_4_;
            bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar129._16_4_ = (uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * auVar115._16_4_;
            bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar129._20_4_ = (uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * auVar115._20_4_;
            bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar129._24_4_ = (uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * auVar115._24_4_;
            bVar17 = SUB81(uVar83 >> 7,0);
            auVar129._28_4_ = (uint)bVar17 * auVar106._28_4_ | (uint)!bVar17 * auVar115._28_4_;
            bVar17 = (bool)((byte)uVar83 & 1);
            auVar130._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar99._0_4_);
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar99._4_4_);
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar99._8_4_);
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar99._12_4_);
            bVar17 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar99._16_4_);
            bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar99._20_4_);
            bVar17 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar99._24_4_);
            bVar17 = SUB81(uVar83 >> 7,0);
            auVar130._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar99._28_4_;
            auVar202._8_4_ = 0x80000000;
            auVar202._0_8_ = 0x8000000080000000;
            auVar202._12_4_ = 0x80000000;
            auVar202._16_4_ = 0x80000000;
            auVar202._20_4_ = 0x80000000;
            auVar202._24_4_ = 0x80000000;
            auVar202._28_4_ = 0x80000000;
            auVar103 = vxorps_avx512vl(auVar129,auVar202);
            auVar99 = auVar216._0_32_;
            auVar101 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar99);
            auVar151 = vfmadd231ps_fma(auVar101,auVar128,auVar128);
            auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar151));
            auVar212._8_4_ = 0xbf000000;
            auVar212._0_8_ = 0xbf000000bf000000;
            auVar212._12_4_ = 0xbf000000;
            auVar212._16_4_ = 0xbf000000;
            auVar212._20_4_ = 0xbf000000;
            auVar212._24_4_ = 0xbf000000;
            auVar212._28_4_ = 0xbf000000;
            fVar166 = auVar101._0_4_;
            fVar147 = auVar101._4_4_;
            fVar186 = auVar101._8_4_;
            fVar187 = auVar101._12_4_;
            fVar188 = auVar101._16_4_;
            fVar181 = auVar101._20_4_;
            fVar91 = auVar101._24_4_;
            auVar58._4_4_ = fVar147 * fVar147 * fVar147 * auVar151._4_4_ * -0.5;
            auVar58._0_4_ = fVar166 * fVar166 * fVar166 * auVar151._0_4_ * -0.5;
            auVar58._8_4_ = fVar186 * fVar186 * fVar186 * auVar151._8_4_ * -0.5;
            auVar58._12_4_ = fVar187 * fVar187 * fVar187 * auVar151._12_4_ * -0.5;
            auVar58._16_4_ = fVar188 * fVar188 * fVar188 * -0.0;
            auVar58._20_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar58._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
            auVar58._28_4_ = auVar128._28_4_;
            auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar101 = vfmadd231ps_avx512vl(auVar58,auVar115,auVar101);
            auVar59._4_4_ = auVar128._4_4_ * auVar101._4_4_;
            auVar59._0_4_ = auVar128._0_4_ * auVar101._0_4_;
            auVar59._8_4_ = auVar128._8_4_ * auVar101._8_4_;
            auVar59._12_4_ = auVar128._12_4_ * auVar101._12_4_;
            auVar59._16_4_ = auVar128._16_4_ * auVar101._16_4_;
            auVar59._20_4_ = auVar128._20_4_ * auVar101._20_4_;
            auVar59._24_4_ = auVar128._24_4_ * auVar101._24_4_;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = auVar101._4_4_ * -auVar127._4_4_;
            auVar60._0_4_ = auVar101._0_4_ * -auVar127._0_4_;
            auVar60._8_4_ = auVar101._8_4_ * -auVar127._8_4_;
            auVar60._12_4_ = auVar101._12_4_ * -auVar127._12_4_;
            auVar60._16_4_ = auVar101._16_4_ * -auVar127._16_4_;
            auVar60._20_4_ = auVar101._20_4_ * -auVar127._20_4_;
            auVar60._24_4_ = auVar101._24_4_ * -auVar127._24_4_;
            auVar60._28_4_ = auVar128._28_4_;
            auVar114 = vmulps_avx512vl(auVar101,auVar99);
            auVar101 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar99);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar130,auVar130);
            auVar105 = vrsqrt14ps_avx512vl(auVar101);
            auVar101 = vmulps_avx512vl(auVar101,auVar212);
            fVar166 = auVar105._0_4_;
            fVar147 = auVar105._4_4_;
            fVar186 = auVar105._8_4_;
            fVar187 = auVar105._12_4_;
            fVar188 = auVar105._16_4_;
            fVar181 = auVar105._20_4_;
            fVar91 = auVar105._24_4_;
            auVar61._4_4_ = fVar147 * fVar147 * fVar147 * auVar101._4_4_;
            auVar61._0_4_ = fVar166 * fVar166 * fVar166 * auVar101._0_4_;
            auVar61._8_4_ = fVar186 * fVar186 * fVar186 * auVar101._8_4_;
            auVar61._12_4_ = fVar187 * fVar187 * fVar187 * auVar101._12_4_;
            auVar61._16_4_ = fVar188 * fVar188 * fVar188 * auVar101._16_4_;
            auVar61._20_4_ = fVar181 * fVar181 * fVar181 * auVar101._20_4_;
            auVar61._24_4_ = fVar91 * fVar91 * fVar91 * auVar101._24_4_;
            auVar61._28_4_ = auVar101._28_4_;
            auVar101 = vfmadd231ps_avx512vl(auVar61,auVar115,auVar105);
            auVar62._4_4_ = auVar130._4_4_ * auVar101._4_4_;
            auVar62._0_4_ = auVar130._0_4_ * auVar101._0_4_;
            auVar62._8_4_ = auVar130._8_4_ * auVar101._8_4_;
            auVar62._12_4_ = auVar130._12_4_ * auVar101._12_4_;
            auVar62._16_4_ = auVar130._16_4_ * auVar101._16_4_;
            auVar62._20_4_ = auVar130._20_4_ * auVar101._20_4_;
            auVar62._24_4_ = auVar130._24_4_ * auVar101._24_4_;
            auVar62._28_4_ = auVar105._28_4_;
            auVar63._4_4_ = auVar101._4_4_ * auVar103._4_4_;
            auVar63._0_4_ = auVar101._0_4_ * auVar103._0_4_;
            auVar63._8_4_ = auVar101._8_4_ * auVar103._8_4_;
            auVar63._12_4_ = auVar101._12_4_ * auVar103._12_4_;
            auVar63._16_4_ = auVar101._16_4_ * auVar103._16_4_;
            auVar63._20_4_ = auVar101._20_4_ * auVar103._20_4_;
            auVar63._24_4_ = auVar101._24_4_ * auVar103._24_4_;
            auVar63._28_4_ = auVar103._28_4_;
            auVar103 = vmulps_avx512vl(auVar101,auVar99);
            auVar151 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar95),auVar100);
            auVar101 = ZEXT1632(auVar95);
            auVar150 = vfmadd213ps_fma(auVar60,auVar101,auVar108);
            auVar115 = vfmadd213ps_avx512vl(auVar114,auVar101,auVar102);
            auVar105 = vfmadd213ps_avx512vl(auVar62,ZEXT1632(auVar94),auVar109);
            auVar96 = vfnmadd213ps_fma(auVar59,auVar101,auVar100);
            auVar113 = ZEXT1632(auVar94);
            auVar93 = vfmadd213ps_fma(auVar63,auVar113,auVar98);
            auVar24 = vfnmadd213ps_fma(auVar60,auVar101,auVar108);
            auVar9 = vfmadd213ps_fma(auVar103,auVar113,auVar104);
            auVar108 = ZEXT1632(auVar95);
            auVar168 = vfnmadd231ps_fma(auVar102,auVar108,auVar114);
            auVar159 = vfnmadd213ps_fma(auVar62,auVar113,auVar109);
            auVar167 = vfnmadd213ps_fma(auVar63,auVar113,auVar98);
            auVar97 = vfnmadd231ps_fma(auVar104,ZEXT1632(auVar94),auVar103);
            auVar104 = vsubps_avx512vl(auVar105,ZEXT1632(auVar96));
            auVar103 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar24));
            auVar101 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar168));
            auVar64._4_4_ = auVar103._4_4_ * auVar168._4_4_;
            auVar64._0_4_ = auVar103._0_4_ * auVar168._0_4_;
            auVar64._8_4_ = auVar103._8_4_ * auVar168._8_4_;
            auVar64._12_4_ = auVar103._12_4_ * auVar168._12_4_;
            auVar64._16_4_ = auVar103._16_4_ * 0.0;
            auVar64._20_4_ = auVar103._20_4_ * 0.0;
            auVar64._24_4_ = auVar103._24_4_ * 0.0;
            auVar64._28_4_ = auVar114._28_4_;
            auVar95 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar24),auVar101);
            auVar65._4_4_ = auVar101._4_4_ * auVar96._4_4_;
            auVar65._0_4_ = auVar101._0_4_ * auVar96._0_4_;
            auVar65._8_4_ = auVar101._8_4_ * auVar96._8_4_;
            auVar65._12_4_ = auVar101._12_4_ * auVar96._12_4_;
            auVar65._16_4_ = auVar101._16_4_ * 0.0;
            auVar65._20_4_ = auVar101._20_4_ * 0.0;
            auVar65._24_4_ = auVar101._24_4_ * 0.0;
            auVar65._28_4_ = auVar101._28_4_;
            auVar10 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar168),auVar104);
            auVar66._4_4_ = auVar24._4_4_ * auVar104._4_4_;
            auVar66._0_4_ = auVar24._0_4_ * auVar104._0_4_;
            auVar66._8_4_ = auVar24._8_4_ * auVar104._8_4_;
            auVar66._12_4_ = auVar24._12_4_ * auVar104._12_4_;
            auVar66._16_4_ = auVar104._16_4_ * 0.0;
            auVar66._20_4_ = auVar104._20_4_ * 0.0;
            auVar66._24_4_ = auVar104._24_4_ * 0.0;
            auVar66._28_4_ = auVar104._28_4_;
            auVar11 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar96),auVar103);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar99,ZEXT1632(auVar10));
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,ZEXT1632(auVar95));
            uVar83 = vcmpps_avx512vl(auVar103,auVar99,2);
            bVar16 = (byte)uVar83;
            fVar139 = (float)((uint)(bVar16 & 1) * auVar151._0_4_ |
                             (uint)!(bool)(bVar16 & 1) * auVar159._0_4_);
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar141 = (float)((uint)bVar17 * auVar151._4_4_ | (uint)!bVar17 * auVar159._4_4_);
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar144 = (float)((uint)bVar17 * auVar151._8_4_ | (uint)!bVar17 * auVar159._8_4_);
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar145 = (float)((uint)bVar17 * auVar151._12_4_ | (uint)!bVar17 * auVar159._12_4_);
            auVar113 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar144,CONCAT44(fVar141,fVar139))));
            fVar140 = (float)((uint)(bVar16 & 1) * auVar150._0_4_ |
                             (uint)!(bool)(bVar16 & 1) * auVar167._0_4_);
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar143 = (float)((uint)bVar17 * auVar150._4_4_ | (uint)!bVar17 * auVar167._4_4_);
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar142 = (float)((uint)bVar17 * auVar150._8_4_ | (uint)!bVar17 * auVar167._8_4_);
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar146 = (float)((uint)bVar17 * auVar150._12_4_ | (uint)!bVar17 * auVar167._12_4_);
            auVar106 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar142,CONCAT44(fVar143,fVar140))));
            auVar131._0_4_ =
                 (float)((uint)(bVar16 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar16 & 1) * auVar97._0_4_);
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar17 * auVar115._4_4_ | (uint)!bVar17 * auVar97._4_4_);
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar17 * auVar115._8_4_ | (uint)!bVar17 * auVar97._8_4_);
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar17 * auVar115._12_4_ | (uint)!bVar17 * auVar97._12_4_);
            fVar147 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar115._16_4_);
            auVar131._16_4_ = fVar147;
            fVar166 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar115._20_4_);
            auVar131._20_4_ = fVar166;
            fVar186 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar115._24_4_);
            auVar131._24_4_ = fVar186;
            iVar1 = (uint)(byte)(uVar83 >> 7) * auVar115._28_4_;
            auVar131._28_4_ = iVar1;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar105);
            auVar132._0_4_ =
                 (uint)(bVar16 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar95._0_4_;
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar95._4_4_;
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar95._8_4_;
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar95._12_4_;
            auVar132._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_;
            auVar132._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_;
            auVar132._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_;
            auVar132._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar24),ZEXT1632(auVar93));
            auVar133._0_4_ =
                 (float)((uint)(bVar16 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar16 & 1) * auVar151._0_4_);
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar151._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar151._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar151._12_4_);
            fVar181 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_);
            auVar133._16_4_ = fVar181;
            fVar188 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_);
            auVar133._20_4_ = fVar188;
            fVar187 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_);
            auVar133._24_4_ = fVar187;
            auVar133._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar168),ZEXT1632(auVar9));
            auVar134._0_4_ =
                 (float)((uint)(bVar16 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar16 & 1) * auVar150._0_4_);
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * auVar150._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * auVar150._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * auVar150._12_4_);
            fVar165 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar103._16_4_);
            auVar134._16_4_ = fVar165;
            fVar92 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar103._20_4_);
            auVar134._20_4_ = fVar92;
            fVar91 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar103._24_4_);
            auVar134._24_4_ = fVar91;
            iVar2 = (uint)(byte)(uVar83 >> 7) * auVar103._28_4_;
            auVar134._28_4_ = iVar2;
            auVar135._0_4_ =
                 (uint)(bVar16 & 1) * (int)auVar96._0_4_ |
                 (uint)!(bool)(bVar16 & 1) * auVar105._0_4_;
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar17 * (int)auVar96._4_4_ | (uint)!bVar17 * auVar105._4_4_;
            bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar17 * (int)auVar96._8_4_ | (uint)!bVar17 * auVar105._8_4_;
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar17 * (int)auVar96._12_4_ | (uint)!bVar17 * auVar105._12_4_;
            auVar135._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar105._16_4_;
            auVar135._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar105._20_4_;
            auVar135._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar105._24_4_;
            auVar135._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar105._28_4_;
            bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar105 = vsubps_avx512vl(auVar135,auVar113);
            auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar24._12_4_ |
                                                     (uint)!bVar21 * auVar93._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar24._8_4_ |
                                                              (uint)!bVar19 * auVar93._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar24._4_4_ |
                                                                       (uint)!bVar17 * auVar93._4_4_
                                                                       ,(uint)(bVar16 & 1) *
                                                                        (int)auVar24._0_4_ |
                                                                        (uint)!(bool)(bVar16 & 1) *
                                                                        auVar93._0_4_)))),auVar106);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar168._12_4_ |
                                                     (uint)!bVar22 * auVar9._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar168._8_4_ |
                                                              (uint)!bVar20 * auVar9._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar168._4_4_ |
                                                                       (uint)!bVar18 * auVar9._4_4_,
                                                                       (uint)(bVar16 & 1) *
                                                                       (int)auVar168._0_4_ |
                                                                       (uint)!(bool)(bVar16 & 1) *
                                                                       auVar9._0_4_)))),auVar131);
            auVar114 = vsubps_avx(auVar113,auVar132);
            auVar104 = vsubps_avx(auVar106,auVar133);
            auVar102 = vsubps_avx(auVar131,auVar134);
            auVar67._4_4_ = auVar115._4_4_ * fVar141;
            auVar67._0_4_ = auVar115._0_4_ * fVar139;
            auVar67._8_4_ = auVar115._8_4_ * fVar144;
            auVar67._12_4_ = auVar115._12_4_ * fVar145;
            auVar67._16_4_ = auVar115._16_4_ * 0.0;
            auVar67._20_4_ = auVar115._20_4_ * 0.0;
            auVar67._24_4_ = auVar115._24_4_ * 0.0;
            auVar67._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar67,auVar131,auVar105);
            auVar179._0_4_ = fVar140 * auVar105._0_4_;
            auVar179._4_4_ = fVar143 * auVar105._4_4_;
            auVar179._8_4_ = fVar142 * auVar105._8_4_;
            auVar179._12_4_ = fVar146 * auVar105._12_4_;
            auVar179._16_4_ = auVar105._16_4_ * 0.0;
            auVar179._20_4_ = auVar105._20_4_ * 0.0;
            auVar179._24_4_ = auVar105._24_4_ * 0.0;
            auVar179._28_4_ = 0;
            auVar151 = vfmsub231ps_fma(auVar179,auVar113,auVar101);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar151),auVar99,ZEXT1632(auVar95));
            auVar184._0_4_ = auVar101._0_4_ * auVar131._0_4_;
            auVar184._4_4_ = auVar101._4_4_ * auVar131._4_4_;
            auVar184._8_4_ = auVar101._8_4_ * auVar131._8_4_;
            auVar184._12_4_ = auVar101._12_4_ * auVar131._12_4_;
            auVar184._16_4_ = auVar101._16_4_ * fVar147;
            auVar184._20_4_ = auVar101._20_4_ * fVar166;
            auVar184._24_4_ = auVar101._24_4_ * fVar186;
            auVar184._28_4_ = 0;
            auVar95 = vfmsub231ps_fma(auVar184,auVar106,auVar115);
            auVar107 = vfmadd231ps_avx512vl(auVar103,auVar99,ZEXT1632(auVar95));
            auVar103 = vmulps_avx512vl(auVar102,auVar132);
            auVar103 = vfmsub231ps_avx512vl(auVar103,auVar114,auVar134);
            auVar68._4_4_ = auVar104._4_4_ * auVar134._4_4_;
            auVar68._0_4_ = auVar104._0_4_ * auVar134._0_4_;
            auVar68._8_4_ = auVar104._8_4_ * auVar134._8_4_;
            auVar68._12_4_ = auVar104._12_4_ * auVar134._12_4_;
            auVar68._16_4_ = auVar104._16_4_ * fVar165;
            auVar68._20_4_ = auVar104._20_4_ * fVar92;
            auVar68._24_4_ = auVar104._24_4_ * fVar91;
            auVar68._28_4_ = iVar2;
            auVar95 = vfmsub231ps_fma(auVar68,auVar133,auVar102);
            auVar185._0_4_ = auVar133._0_4_ * auVar114._0_4_;
            auVar185._4_4_ = auVar133._4_4_ * auVar114._4_4_;
            auVar185._8_4_ = auVar133._8_4_ * auVar114._8_4_;
            auVar185._12_4_ = auVar133._12_4_ * auVar114._12_4_;
            auVar185._16_4_ = fVar181 * auVar114._16_4_;
            auVar185._20_4_ = fVar188 * auVar114._20_4_;
            auVar185._24_4_ = fVar187 * auVar114._24_4_;
            auVar185._28_4_ = 0;
            auVar151 = vfmsub231ps_fma(auVar185,auVar104,auVar132);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar151),auVar99,auVar103);
            auVar100 = vfmadd231ps_avx512vl(auVar103,auVar99,ZEXT1632(auVar95));
            auVar103 = vmaxps_avx(auVar107,auVar100);
            uVar149 = vcmpps_avx512vl(auVar103,auVar99,2);
            bVar90 = bVar90 & (byte)uVar149;
            if (bVar90 == 0) {
LAB_01dbc94b:
              bVar90 = 0;
            }
            else {
              auVar69._4_4_ = auVar102._4_4_ * auVar101._4_4_;
              auVar69._0_4_ = auVar102._0_4_ * auVar101._0_4_;
              auVar69._8_4_ = auVar102._8_4_ * auVar101._8_4_;
              auVar69._12_4_ = auVar102._12_4_ * auVar101._12_4_;
              auVar69._16_4_ = auVar102._16_4_ * auVar101._16_4_;
              auVar69._20_4_ = auVar102._20_4_ * auVar101._20_4_;
              auVar69._24_4_ = auVar102._24_4_ * auVar101._24_4_;
              auVar69._28_4_ = auVar103._28_4_;
              auVar150 = vfmsub231ps_fma(auVar69,auVar104,auVar115);
              auVar70._4_4_ = auVar115._4_4_ * auVar114._4_4_;
              auVar70._0_4_ = auVar115._0_4_ * auVar114._0_4_;
              auVar70._8_4_ = auVar115._8_4_ * auVar114._8_4_;
              auVar70._12_4_ = auVar115._12_4_ * auVar114._12_4_;
              auVar70._16_4_ = auVar115._16_4_ * auVar114._16_4_;
              auVar70._20_4_ = auVar115._20_4_ * auVar114._20_4_;
              auVar70._24_4_ = auVar115._24_4_ * auVar114._24_4_;
              auVar70._28_4_ = auVar115._28_4_;
              auVar151 = vfmsub231ps_fma(auVar70,auVar105,auVar102);
              auVar71._4_4_ = auVar104._4_4_ * auVar105._4_4_;
              auVar71._0_4_ = auVar104._0_4_ * auVar105._0_4_;
              auVar71._8_4_ = auVar104._8_4_ * auVar105._8_4_;
              auVar71._12_4_ = auVar104._12_4_ * auVar105._12_4_;
              auVar71._16_4_ = auVar104._16_4_ * auVar105._16_4_;
              auVar71._20_4_ = auVar104._20_4_ * auVar105._20_4_;
              auVar71._24_4_ = auVar104._24_4_ * auVar105._24_4_;
              auVar71._28_4_ = auVar104._28_4_;
              auVar93 = vfmsub231ps_fma(auVar71,auVar114,auVar101);
              auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar151),ZEXT1632(auVar93));
              auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar150),auVar99);
              auVar101 = vrcp14ps_avx512vl(auVar103);
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = &DAT_3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar33._16_4_ = 0x3f800000;
              auVar33._20_4_ = 0x3f800000;
              auVar33._24_4_ = 0x3f800000;
              auVar33._28_4_ = 0x3f800000;
              auVar115 = vfnmadd213ps_avx512vl(auVar101,auVar103,auVar33);
              auVar95 = vfmadd132ps_fma(auVar115,auVar101,auVar101);
              auVar72._4_4_ = auVar93._4_4_ * auVar131._4_4_;
              auVar72._0_4_ = auVar93._0_4_ * auVar131._0_4_;
              auVar72._8_4_ = auVar93._8_4_ * auVar131._8_4_;
              auVar72._12_4_ = auVar93._12_4_ * auVar131._12_4_;
              auVar72._16_4_ = fVar147 * 0.0;
              auVar72._20_4_ = fVar166 * 0.0;
              auVar72._24_4_ = fVar186 * 0.0;
              auVar72._28_4_ = iVar1;
              auVar151 = vfmadd231ps_fma(auVar72,auVar106,ZEXT1632(auVar151));
              auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar113,ZEXT1632(auVar150));
              fVar147 = auVar95._0_4_;
              fVar186 = auVar95._4_4_;
              fVar187 = auVar95._8_4_;
              fVar188 = auVar95._12_4_;
              auVar101 = ZEXT1632(CONCAT412(auVar151._12_4_ * fVar188,
                                            CONCAT48(auVar151._8_4_ * fVar187,
                                                     CONCAT44(auVar151._4_4_ * fVar186,
                                                              auVar151._0_4_ * fVar147))));
              auVar80._4_4_ = uStack_39c;
              auVar80._0_4_ = local_3a0;
              auVar80._8_4_ = uStack_398;
              auVar80._12_4_ = uStack_394;
              auVar80._16_4_ = uStack_390;
              auVar80._20_4_ = uStack_38c;
              auVar80._24_4_ = uStack_388;
              auVar80._28_4_ = uStack_384;
              uVar149 = vcmpps_avx512vl(auVar101,auVar80,0xd);
              fVar166 = (ray->super_RayK<1>).tfar;
              auVar34._4_4_ = fVar166;
              auVar34._0_4_ = fVar166;
              auVar34._8_4_ = fVar166;
              auVar34._12_4_ = fVar166;
              auVar34._16_4_ = fVar166;
              auVar34._20_4_ = fVar166;
              auVar34._24_4_ = fVar166;
              auVar34._28_4_ = fVar166;
              uVar25 = vcmpps_avx512vl(auVar101,auVar34,2);
              bVar90 = (byte)uVar149 & (byte)uVar25 & bVar90;
              if (bVar90 == 0) goto LAB_01dbc94b;
              uVar149 = vcmpps_avx512vl(auVar103,auVar99,4);
              if ((bVar90 & (byte)uVar149) == 0) {
                bVar90 = 0;
              }
              else {
                bVar90 = bVar90 & (byte)uVar149;
                fVar166 = auVar107._0_4_ * fVar147;
                fVar181 = auVar107._4_4_ * fVar186;
                auVar73._4_4_ = fVar181;
                auVar73._0_4_ = fVar166;
                fVar91 = auVar107._8_4_ * fVar187;
                auVar73._8_4_ = fVar91;
                fVar92 = auVar107._12_4_ * fVar188;
                auVar73._12_4_ = fVar92;
                fVar165 = auVar107._16_4_ * 0.0;
                auVar73._16_4_ = fVar165;
                fVar139 = auVar107._20_4_ * 0.0;
                auVar73._20_4_ = fVar139;
                fVar140 = auVar107._24_4_ * 0.0;
                auVar73._24_4_ = fVar140;
                auVar73._28_4_ = auVar107._28_4_;
                fVar147 = auVar100._0_4_ * fVar147;
                fVar186 = auVar100._4_4_ * fVar186;
                auVar74._4_4_ = fVar186;
                auVar74._0_4_ = fVar147;
                fVar187 = auVar100._8_4_ * fVar187;
                auVar74._8_4_ = fVar187;
                fVar188 = auVar100._12_4_ * fVar188;
                auVar74._12_4_ = fVar188;
                fVar141 = auVar100._16_4_ * 0.0;
                auVar74._16_4_ = fVar141;
                fVar143 = auVar100._20_4_ * 0.0;
                auVar74._20_4_ = fVar143;
                fVar144 = auVar100._24_4_ * 0.0;
                auVar74._24_4_ = fVar144;
                auVar74._28_4_ = auVar100._28_4_;
                auVar194._8_4_ = 0x3f800000;
                auVar194._0_8_ = &DAT_3f8000003f800000;
                auVar194._12_4_ = 0x3f800000;
                auVar194._16_4_ = 0x3f800000;
                auVar194._20_4_ = 0x3f800000;
                auVar194._24_4_ = 0x3f800000;
                auVar194._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx512vl(auVar194,auVar73);
                bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar23 = SUB81(uVar83 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar23 * auVar107._28_4_ |
                                              (uint)!bVar23 * auVar103._28_4_,
                                              CONCAT424((uint)bVar22 * (int)fVar140 |
                                                        (uint)!bVar22 * auVar103._24_4_,
                                                        CONCAT420((uint)bVar21 * (int)fVar139 |
                                                                  (uint)!bVar21 * auVar103._20_4_,
                                                                  CONCAT416((uint)bVar20 *
                                                                            (int)fVar165 |
                                                                            (uint)!bVar20 *
                                                                            auVar103._16_4_,
                                                                            CONCAT412((uint)bVar19 *
                                                                                      (int)fVar92 |
                                                                                      (uint)!bVar19
                                                                                      * auVar103.
                                                  _12_4_,CONCAT48((uint)bVar18 * (int)fVar91 |
                                                                  (uint)!bVar18 * auVar103._8_4_,
                                                                  CONCAT44((uint)bVar17 *
                                                                           (int)fVar181 |
                                                                           (uint)!bVar17 *
                                                                           auVar103._4_4_,
                                                                           (uint)(bVar16 & 1) *
                                                                           (int)fVar166 |
                                                                           (uint)!(bool)(bVar16 & 1)
                                                                           * auVar103._0_4_))))))));
                auVar103 = vsubps_avx(auVar194,auVar74);
                bVar17 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar23 = SUB81(uVar83 >> 7,0);
                local_240._4_4_ = (uint)bVar17 * (int)fVar186 | (uint)!bVar17 * auVar103._4_4_;
                local_240._0_4_ =
                     (uint)(bVar16 & 1) * (int)fVar147 | (uint)!(bool)(bVar16 & 1) * auVar103._0_4_;
                local_240._8_4_ = (uint)bVar18 * (int)fVar187 | (uint)!bVar18 * auVar103._8_4_;
                local_240._12_4_ = (uint)bVar19 * (int)fVar188 | (uint)!bVar19 * auVar103._12_4_;
                local_240._16_4_ = (uint)bVar20 * (int)fVar141 | (uint)!bVar20 * auVar103._16_4_;
                local_240._20_4_ = (uint)bVar21 * (int)fVar143 | (uint)!bVar21 * auVar103._20_4_;
                local_240._24_4_ = (uint)bVar22 * (int)fVar144 | (uint)!bVar22 * auVar103._24_4_;
                local_240._28_4_ = (uint)bVar23 * auVar100._28_4_ | (uint)!bVar23 * auVar103._28_4_;
                in_ZMM21 = ZEXT3264(auVar101);
              }
            }
            auVar214 = ZEXT3264(local_500);
            auVar213 = ZEXT3264(local_4e0);
            auVar217 = ZEXT1664(local_600);
            auVar197 = ZEXT3264(local_580);
            auVar180 = ZEXT3264(local_5e0);
            if (bVar90 != 0) {
              auVar103 = vsubps_avx(ZEXT1632(auVar94),auVar108);
              local_360 = in_ZMM20._0_32_;
              auVar103 = vfmadd213ps_avx512vl(auVar103,local_360,auVar108);
              auVar154._0_4_ = auVar103._0_4_ + auVar103._0_4_;
              auVar154._4_4_ = auVar103._4_4_ + auVar103._4_4_;
              auVar154._8_4_ = auVar103._8_4_ + auVar103._8_4_;
              auVar154._12_4_ = auVar103._12_4_ + auVar103._12_4_;
              auVar154._16_4_ = auVar103._16_4_ + auVar103._16_4_;
              auVar154._20_4_ = auVar103._20_4_ + auVar103._20_4_;
              auVar154._24_4_ = auVar103._24_4_ + auVar103._24_4_;
              auVar154._28_4_ = auVar103._28_4_ + auVar103._28_4_;
              fVar166 = pre->depth_scale;
              auVar35._4_4_ = fVar166;
              auVar35._0_4_ = fVar166;
              auVar35._8_4_ = fVar166;
              auVar35._12_4_ = fVar166;
              auVar35._16_4_ = fVar166;
              auVar35._20_4_ = fVar166;
              auVar35._24_4_ = fVar166;
              auVar35._28_4_ = fVar166;
              auVar103 = vmulps_avx512vl(auVar154,auVar35);
              local_320 = in_ZMM21._0_32_;
              uVar149 = vcmpps_avx512vl(local_320,auVar103,6);
              bVar90 = bVar90 & (byte)uVar149;
              if (bVar90 != 0) {
                auVar155._8_4_ = 0xbf800000;
                auVar155._0_8_ = 0xbf800000bf800000;
                auVar155._12_4_ = 0xbf800000;
                auVar155._16_4_ = 0xbf800000;
                auVar155._20_4_ = 0xbf800000;
                auVar155._24_4_ = 0xbf800000;
                auVar155._28_4_ = 0xbf800000;
                auVar36._8_4_ = 0x40000000;
                auVar36._0_8_ = 0x4000000040000000;
                auVar36._12_4_ = 0x40000000;
                auVar36._16_4_ = 0x40000000;
                auVar36._20_4_ = 0x40000000;
                auVar36._24_4_ = 0x40000000;
                auVar36._28_4_ = 0x40000000;
                local_240 = vfmadd132ps_avx512vl(local_240,auVar155,auVar36);
                auVar103 = local_240;
                local_340 = local_240;
                local_300 = (int)lVar86;
                local_2fc = iVar13;
                local_2f0 = local_600;
                local_2e0 = local_550;
                uStack_2d8 = uStack_548;
                local_2d0 = local_560;
                uStack_2c8 = uStack_558;
                local_2c0 = CONCAT44(fStack_53c,local_540);
                uStack_2b8 = CONCAT44(fStack_534,fStack_538);
                local_2b0 = bVar90;
                local_4b0 = (context->scene->geometries).items[local_608].ptr;
                local_240 = auVar103;
                if ((local_4b0->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar101 = vaddps_avx512vl(local_360,_DAT_02020f40);
                  auVar95 = vcvtsi2ss_avx512f(auVar215._0_16_,(int)lVar86);
                  fVar166 = auVar95._0_4_;
                  local_2a0[0] = (fVar166 + auVar101._0_4_) * (float)local_380._0_4_;
                  local_2a0[1] = (fVar166 + auVar101._4_4_) * (float)local_380._4_4_;
                  local_2a0[2] = (fVar166 + auVar101._8_4_) * fStack_378;
                  local_2a0[3] = (fVar166 + auVar101._12_4_) * fStack_374;
                  fStack_290 = (fVar166 + auVar101._16_4_) * fStack_370;
                  fStack_28c = (fVar166 + auVar101._20_4_) * fStack_36c;
                  fStack_288 = (fVar166 + auVar101._24_4_) * fStack_368;
                  fStack_284 = fVar166 + auVar101._28_4_;
                  local_280 = local_240._0_8_;
                  uStack_278 = local_240._8_8_;
                  uStack_270 = local_240._16_8_;
                  uStack_268 = local_240._24_8_;
                  local_260 = local_320;
                  auVar156._8_4_ = 0x7f800000;
                  auVar156._0_8_ = 0x7f8000007f800000;
                  auVar156._12_4_ = 0x7f800000;
                  auVar156._16_4_ = 0x7f800000;
                  auVar156._20_4_ = 0x7f800000;
                  auVar156._24_4_ = 0x7f800000;
                  auVar156._28_4_ = 0x7f800000;
                  auVar101 = vblendmps_avx512vl(auVar156,local_320);
                  auVar136._0_4_ =
                       (uint)(bVar90 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                  bVar17 = (bool)(bVar90 >> 1 & 1);
                  auVar136._4_4_ = (uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(bVar90 >> 2 & 1);
                  auVar136._8_4_ = (uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(bVar90 >> 3 & 1);
                  auVar136._12_4_ = (uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(bVar90 >> 4 & 1);
                  auVar136._16_4_ = (uint)bVar17 * auVar101._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(bVar90 >> 5 & 1);
                  auVar136._20_4_ = (uint)bVar17 * auVar101._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(bVar90 >> 6 & 1);
                  auVar136._24_4_ = (uint)bVar17 * auVar101._24_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar136._28_4_ =
                       (uint)(bVar90 >> 7) * auVar101._28_4_ |
                       (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                  auVar101 = vshufps_avx(auVar136,auVar136,0xb1);
                  auVar101 = vminps_avx(auVar136,auVar101);
                  auVar115 = vshufpd_avx(auVar101,auVar101,5);
                  auVar101 = vminps_avx(auVar101,auVar115);
                  auVar115 = vpermpd_avx2(auVar101,0x4e);
                  auVar101 = vminps_avx(auVar101,auVar115);
                  uVar149 = vcmpps_avx512vl(auVar136,auVar101,0);
                  bVar82 = (byte)uVar149 & bVar90;
                  bVar16 = bVar90;
                  if (bVar82 != 0) {
                    bVar16 = bVar82;
                  }
                  uVar88 = 0;
                  for (uVar85 = (uint)bVar16; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000)
                  {
                    uVar88 = uVar88 + 1;
                  }
                  uVar83 = (ulong)uVar88;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_4b0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar166 = local_2a0[uVar83];
                    fVar147 = *(float *)((long)&local_280 + uVar83 * 4);
                    fVar186 = 1.0 - fVar166;
                    auVar150 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar186 + fVar186))),
                                                ZEXT416((uint)fVar186),ZEXT416((uint)fVar186));
                    auVar151 = ZEXT416((uint)fVar166);
                    auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar151,
                                              ZEXT416(0xc0a00000));
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                              ZEXT416((uint)(fVar166 + fVar166)),auVar95);
                    auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar151,
                                              ZEXT416(0x40000000));
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar186 * fVar186 * -3.0)),
                                              ZEXT416((uint)(fVar186 + fVar186)),auVar95);
                    auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar151,
                                               ZEXT416((uint)(fVar186 * -2.0)));
                    fVar186 = auVar150._0_4_ * 0.5;
                    fVar187 = auVar94._0_4_ * 0.5;
                    fVar188 = auVar95._0_4_ * 0.5;
                    fVar181 = auVar151._0_4_ * 0.5;
                    auVar171._0_4_ = fVar181 * local_540;
                    auVar171._4_4_ = fVar181 * fStack_53c;
                    auVar171._8_4_ = fVar181 * fStack_538;
                    auVar171._12_4_ = fVar181 * fStack_534;
                    auVar190._4_4_ = fVar188;
                    auVar190._0_4_ = fVar188;
                    auVar190._8_4_ = fVar188;
                    auVar190._12_4_ = fVar188;
                    auVar75._8_8_ = uStack_558;
                    auVar75._0_8_ = local_560;
                    auVar95 = vfmadd132ps_fma(auVar190,auVar171,auVar75);
                    auVar172._4_4_ = fVar187;
                    auVar172._0_4_ = fVar187;
                    auVar172._8_4_ = fVar187;
                    auVar172._12_4_ = fVar187;
                    auVar76._8_8_ = uStack_548;
                    auVar76._0_8_ = local_550;
                    auVar95 = vfmadd132ps_fma(auVar172,auVar95,auVar76);
                    auVar161._4_4_ = fVar186;
                    auVar161._0_4_ = fVar186;
                    auVar161._8_4_ = fVar186;
                    auVar161._12_4_ = fVar186;
                    (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar83 * 4);
                    auVar95 = vfmadd213ps_fma(auVar161,local_600,auVar95);
                    uVar149 = vmovlps_avx(auVar95);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar149;
                    fVar186 = (float)vextractps_avx(auVar95,2);
                    (ray->Ng).field_0.field_0.z = fVar186;
                    ray->u = fVar166;
                    ray->v = fVar147;
                    ray->primID = (uint)local_5e8;
                    ray->geomID = (uint)local_608;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    auVar197 = ZEXT3264(local_580);
                    auVar180 = ZEXT3264(local_5e0);
                  }
                  else {
                    local_420 = (float)local_550;
                    fStack_41c = (float)((ulong)local_550 >> 0x20);
                    fStack_418 = (float)uStack_548;
                    fStack_414 = (float)((ulong)uStack_548 >> 0x20);
                    local_1f0 = local_560;
                    uStack_1e8 = uStack_558;
                    local_200 = CONCAT44(fStack_53c,local_540);
                    uStack_1f8 = CONCAT44(fStack_534,fStack_538);
                    local_440 = local_360;
                    local_460 = local_320;
                    local_610 = prim;
                    local_618 = context;
                    local_620 = pre;
                    do {
                      auVar93 = auVar216._0_16_;
                      local_524 = local_2a0[uVar83];
                      local_520 = *(undefined4 *)((long)&local_280 + uVar83 * 4);
                      local_410 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar83 * 4);
                      local_5b0.context = context->user;
                      fVar166 = 1.0 - local_524;
                      auVar150 = vfnmadd231ss_fma(ZEXT416((uint)(local_524 * (fVar166 + fVar166))),
                                                  ZEXT416((uint)fVar166),ZEXT416((uint)fVar166));
                      auVar151 = ZEXT416((uint)local_524);
                      auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar151,
                                                ZEXT416(0xc0a00000));
                      auVar94 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524 * 3.0)),
                                                ZEXT416((uint)(local_524 + local_524)),auVar95);
                      auVar95 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar151,
                                                ZEXT416(0x40000000));
                      auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * -3.0)),
                                                ZEXT416((uint)(fVar166 + fVar166)),auVar95);
                      auVar151 = vfmadd231ss_fma(ZEXT416((uint)(local_524 * local_524)),auVar151,
                                                 ZEXT416((uint)(fVar166 * -2.0)));
                      fVar166 = auVar150._0_4_ * 0.5;
                      fVar147 = auVar94._0_4_ * 0.5;
                      fVar186 = auVar95._0_4_ * 0.5;
                      fVar187 = auVar151._0_4_ * 0.5;
                      auVar173._0_4_ = fVar187 * (float)local_200;
                      auVar173._4_4_ = fVar187 * local_200._4_4_;
                      auVar173._8_4_ = fVar187 * (float)uStack_1f8;
                      auVar173._12_4_ = fVar187 * uStack_1f8._4_4_;
                      auVar191._4_4_ = fVar186;
                      auVar191._0_4_ = fVar186;
                      auVar191._8_4_ = fVar186;
                      auVar191._12_4_ = fVar186;
                      auVar81._8_8_ = uStack_1e8;
                      auVar81._0_8_ = local_1f0;
                      auVar95 = vfmadd132ps_fma(auVar191,auVar173,auVar81);
                      auVar174._4_4_ = fVar147;
                      auVar174._0_4_ = fVar147;
                      auVar174._8_4_ = fVar147;
                      auVar174._12_4_ = fVar147;
                      auVar78._4_4_ = fStack_41c;
                      auVar78._0_4_ = local_420;
                      auVar78._8_4_ = fStack_418;
                      auVar78._12_4_ = fStack_414;
                      auVar95 = vfmadd132ps_fma(auVar174,auVar95,auVar78);
                      auVar162._4_4_ = fVar166;
                      auVar162._0_4_ = fVar166;
                      auVar162._8_4_ = fVar166;
                      auVar162._12_4_ = fVar166;
                      auVar95 = vfmadd213ps_fma(auVar162,auVar217._0_16_,auVar95);
                      local_530 = vmovlps_avx(auVar95);
                      local_528 = vextractps_avx(auVar95,2);
                      local_51c = (int)local_5e8;
                      local_518 = (int)local_608;
                      local_514 = (local_5b0.context)->instID[0];
                      local_510 = (local_5b0.context)->instPrimID[0];
                      local_624 = -1;
                      local_5b0.valid = &local_624;
                      local_5b0.geometryUserPtr = local_4b0->userPtr;
                      local_5b0.ray = (RTCRayN *)ray;
                      local_5b0.hit = (RTCHitN *)&local_530;
                      local_5b0.N = 1;
                      if (local_4b0->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01dbcc16:
                        auVar95 = auVar216._0_16_;
                        p_Var15 = context->args->filter;
                        if (p_Var15 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_4b0->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var15)(&local_5b0);
                            auVar219 = ZEXT3264(local_4a0);
                            auVar218 = ZEXT3264(local_480);
                            auVar214 = ZEXT3264(local_500);
                            auVar213 = ZEXT3264(local_4e0);
                            auVar215 = ZEXT3264(local_3e0);
                            auVar217 = ZEXT1664(local_600);
                            in_ZMM21 = ZEXT3264(local_460);
                            in_ZMM20 = ZEXT3264(local_440);
                            auVar95 = vxorps_avx512vl(auVar95,auVar95);
                            auVar216 = ZEXT1664(auVar95);
                            context = local_618;
                            prim = local_610;
                            pre = local_620;
                          }
                          if (*local_5b0.valid == 0) goto LAB_01dbcd13;
                        }
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5b0.hit;
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5b0.hit + 4);
                        (((Vec3f *)((long)local_5b0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5b0.hit + 8);
                        *(float *)((long)local_5b0.ray + 0x3c) = *(float *)(local_5b0.hit + 0xc);
                        *(float *)((long)local_5b0.ray + 0x40) = *(float *)(local_5b0.hit + 0x10);
                        *(float *)((long)local_5b0.ray + 0x44) = *(float *)(local_5b0.hit + 0x14);
                        *(float *)((long)local_5b0.ray + 0x48) = *(float *)(local_5b0.hit + 0x18);
                        *(float *)((long)local_5b0.ray + 0x4c) = *(float *)(local_5b0.hit + 0x1c);
                        *(float *)((long)local_5b0.ray + 0x50) = *(float *)(local_5b0.hit + 0x20);
                      }
                      else {
                        (*local_4b0->intersectionFilterN)(&local_5b0);
                        auVar219 = ZEXT3264(local_4a0);
                        auVar218 = ZEXT3264(local_480);
                        auVar214 = ZEXT3264(local_500);
                        auVar213 = ZEXT3264(local_4e0);
                        auVar215 = ZEXT3264(local_3e0);
                        auVar217 = ZEXT1664(local_600);
                        in_ZMM21 = ZEXT3264(local_460);
                        in_ZMM20 = ZEXT3264(local_440);
                        auVar95 = vxorps_avx512vl(auVar93,auVar93);
                        auVar216 = ZEXT1664(auVar95);
                        context = local_618;
                        prim = local_610;
                        pre = local_620;
                        if (*local_5b0.valid != 0) goto LAB_01dbcc16;
LAB_01dbcd13:
                        (ray->super_RayK<1>).tfar = local_410;
                      }
                      bVar16 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & bVar90;
                      fVar166 = (ray->super_RayK<1>).tfar;
                      auVar37._4_4_ = fVar166;
                      auVar37._0_4_ = fVar166;
                      auVar37._8_4_ = fVar166;
                      auVar37._12_4_ = fVar166;
                      auVar37._16_4_ = fVar166;
                      auVar37._20_4_ = fVar166;
                      auVar37._24_4_ = fVar166;
                      auVar37._28_4_ = fVar166;
                      uVar149 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar37,2);
                      bVar90 = bVar16 & (byte)uVar149;
                      auVar197 = ZEXT3264(local_580);
                      auVar180 = ZEXT3264(local_5e0);
                      if ((bVar16 & (byte)uVar149) != 0) {
                        auVar157._8_4_ = 0x7f800000;
                        auVar157._0_8_ = 0x7f8000007f800000;
                        auVar157._12_4_ = 0x7f800000;
                        auVar157._16_4_ = 0x7f800000;
                        auVar157._20_4_ = 0x7f800000;
                        auVar157._24_4_ = 0x7f800000;
                        auVar157._28_4_ = 0x7f800000;
                        auVar103 = vblendmps_avx512vl(auVar157,in_ZMM21._0_32_);
                        auVar137._0_4_ =
                             (uint)(bVar90 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar90 >> 1 & 1);
                        auVar137._4_4_ = (uint)bVar17 * auVar103._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar90 >> 2 & 1);
                        auVar137._8_4_ = (uint)bVar17 * auVar103._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar90 >> 3 & 1);
                        auVar137._12_4_ =
                             (uint)bVar17 * auVar103._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar90 >> 4 & 1);
                        auVar137._16_4_ =
                             (uint)bVar17 * auVar103._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar90 >> 5 & 1);
                        auVar137._20_4_ =
                             (uint)bVar17 * auVar103._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar90 >> 6 & 1);
                        auVar137._24_4_ =
                             (uint)bVar17 * auVar103._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar137._28_4_ =
                             (uint)(bVar90 >> 7) * auVar103._28_4_ |
                             (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                        auVar103 = vshufps_avx(auVar137,auVar137,0xb1);
                        auVar103 = vminps_avx(auVar137,auVar103);
                        auVar101 = vshufpd_avx(auVar103,auVar103,5);
                        auVar103 = vminps_avx(auVar103,auVar101);
                        auVar101 = vpermpd_avx2(auVar103,0x4e);
                        auVar103 = vminps_avx(auVar103,auVar101);
                        uVar149 = vcmpps_avx512vl(auVar137,auVar103,0);
                        bVar82 = (byte)uVar149 & bVar90;
                        bVar16 = bVar90;
                        if (bVar82 != 0) {
                          bVar16 = bVar82;
                        }
                        uVar88 = 0;
                        for (uVar85 = (uint)bVar16; (uVar85 & 1) == 0;
                            uVar85 = uVar85 >> 1 | 0x80000000) {
                          uVar88 = uVar88 + 1;
                        }
                        uVar83 = (ulong)uVar88;
                      }
                    } while (bVar90 != 0);
                  }
                }
              }
            }
          }
          lVar86 = lVar86 + 8;
        } while ((int)lVar86 < iVar13);
      }
      fVar166 = (ray->super_RayK<1>).tfar;
      auVar32._4_4_ = fVar166;
      auVar32._0_4_ = fVar166;
      auVar32._8_4_ = fVar166;
      auVar32._12_4_ = fVar166;
      auVar32._16_4_ = fVar166;
      auVar32._20_4_ = fVar166;
      auVar32._24_4_ = fVar166;
      auVar32._28_4_ = fVar166;
      uVar149 = vcmpps_avx512vl(local_80,auVar32,2);
      uVar88 = (uint)uVar89 & (uint)uVar149;
      uVar89 = (ulong)uVar88;
    } while (uVar88 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }